

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx512::forward_fp16s
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  unsigned_short *puVar1;
  undefined4 uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int *piVar7;
  void *pvVar8;
  void *pvVar9;
  size_t sVar10;
  undefined4 *puVar11;
  uint *puVar12;
  float *pfVar13;
  bool bVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float afVar125 [16];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  float afVar129 [16];
  float afVar130 [16];
  float afVar131 [16];
  float afVar132 [16];
  float afVar133 [16];
  float afVar134 [16];
  float afVar135 [16];
  int iVar136;
  uint uVar137;
  ulong uVar138;
  undefined1 (*pauVar139) [32];
  ulong uVar140;
  long lVar141;
  long lVar142;
  long lVar143;
  int iVar144;
  long lVar145;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar177 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 (*pauVar146) [16];
  undefined1 (*pauVar147) [16];
  long lVar148;
  undefined1 (*pauVar149) [32];
  long lVar150;
  undefined1 (*pauVar151) [16];
  int iVar152;
  long lVar153;
  undefined1 (*pauVar154) [16];
  long lVar155;
  long lVar156;
  long lVar157;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar158 [16];
  undefined1 auVar184 [28];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  float fVar224;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined1 auVar231 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar253;
  __m128 pos;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar271;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  v4sf one;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  __m128 pos_1;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar334 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar335 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar336 [64];
  undefined1 (*local_368) [32];
  int *piStack_360;
  size_t local_358;
  int local_350;
  Allocator *local_348;
  int local_340;
  int local_33c;
  undefined8 local_338;
  int local_330;
  size_t local_328;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  undefined1 local_2e8 [16];
  undefined8 local_2d8;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  float local_278;
  undefined1 local_268 [16];
  float local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  ulong local_1d8;
  long local_1d0;
  ulong local_1c8;
  long local_1c0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  Option opt_flatten;
  
  auVar158 = in_ZMM30._0_16_;
  local_340 = bottom_blob->dims;
  if (local_340 == 2) {
    iVar136 = (this->super_InnerProduct).num_output;
    local_33c = bottom_blob->w;
    if (local_33c == (this->super_InnerProduct).weight_data_size / iVar136) {
      Mat::create(top_blob,iVar136,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      innerproduct_gemm_fp16s_sse
                (bottom_blob,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
                 (this->super_InnerProduct).activation_type,
                 &(this->super_InnerProduct).activation_params,opt);
      return 0;
    }
  }
  else {
    local_33c = bottom_blob->w;
  }
  piVar7 = bottom_blob->refcount;
  local_368 = (undefined1 (*) [32])bottom_blob->data;
  piStack_360 = bottom_blob->refcount;
  local_358 = bottom_blob->elemsize;
  local_350 = bottom_blob->elempack;
  local_348 = bottom_blob->allocator;
  local_338._0_4_ = bottom_blob->h;
  local_338._4_4_ = bottom_blob->d;
  local_330 = bottom_blob->c;
  local_328 = bottom_blob->cstep;
  iVar136 = local_340;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
    iVar136 = bottom_blob->dims;
  }
  iVar152 = -100;
  if (iVar136 != 1) {
    opt_flatten._16_48_ = SUB6448(*opt,0x10);
    opt_flatten._0_8_ = SUB648(*opt,0);
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_368);
    if ((local_368 == (undefined1 (*) [32])0x0) || ((long)local_330 * local_328 == 0))
    goto LAB_0029dffb;
  }
  uVar6 = (this->super_InnerProduct).num_output;
  if (opt->use_packing_layout == true) {
    if ((uVar6 & 0xf) == 0) {
      uVar137 = 0x10;
    }
    else if ((uVar6 & 7) == 0) {
      uVar137 = 8;
    }
    else {
      uVar137 = (uint)((uVar6 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar137 = 1;
  }
  Mat::create(top_blob,(int)uVar6 / (int)uVar137,
              (ulong)uVar137 * (local_358 / (ulong)(long)local_350),uVar137,opt->blob_allocator);
  afVar135 = _ps512_cephes_log_q1;
  afVar134 = ::_ps512_cephes_exp_p5;
  afVar133 = ::_ps512_cephes_exp_p4;
  afVar132 = ::_ps512_cephes_exp_p3;
  afVar131 = ::_ps512_cephes_exp_p2;
  afVar130 = ::_ps512_cephes_exp_p1;
  afVar129 = ::_ps512_cephes_exp_p0;
  afVar128 = ::_ps512_cephes_LOG2EF;
  afVar127 = ::_ps512_exp_lo;
  afVar126 = ::_ps512_exp_hi;
  afVar125 = ::_ps512_1;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar136 = (this->super_InnerProduct).activation_type;
    iVar144 = local_350 * local_33c;
    iVar152 = top_blob->elempack;
    uVar6 = top_blob->w;
    uVar140 = (ulong)uVar6;
    pvVar8 = (this->super_InnerProduct).bias_data.data;
    if (iVar152 == 1) {
      uVar140 = 0;
      local_1d8 = (ulong)(uint)((int)uVar6 >> 3);
      if ((int)uVar6 >> 3 < 1) {
        local_1d8 = uVar140;
      }
      lVar141 = 1;
      lVar145 = 2;
      lVar148 = 3;
      lVar150 = 4;
      lVar153 = 5;
      lVar155 = 6;
      lVar157 = 7;
      uVar138 = 0;
      while (pauVar149 = local_368, uVar138 != local_1d8) {
        local_1d0 = uVar138 * 8;
        auVar158 = ZEXT816(0) << 0x40;
        auVar208 = ZEXT1664(ZEXT816(0) << 0x40);
        if (pvVar8 != (void *)0x0) {
          auVar208 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar8 + uVar138 * 0x20));
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar142 = (long)(this->weight_data_tm).w;
        local_238._0_8_ = lVar142;
        lVar156 = 0;
        lVar143 = 0;
        auVar162 = ZEXT816(0) << 0x40;
        auVar161 = ZEXT816(0) << 0x40;
        auVar160 = ZEXT816(0) << 0x40;
        auVar159 = ZEXT816(0) << 0x40;
        auVar177 = ZEXT816(0) << 0x40;
        local_1f8._0_16_ = ZEXT816(0);
        local_218._0_16_ = ZEXT816(0);
        local_218 = ZEXT1632(local_218._0_16_);
        iVar152 = 0;
        while( true ) {
          local_1f8 = ZEXT1632(local_1f8._0_16_);
          auVar214 = ZEXT1664(auVar177);
          auVar213 = ZEXT1664(auVar159);
          auVar212 = ZEXT1664(auVar160);
          auVar211 = ZEXT1664(auVar161);
          auVar210 = ZEXT1664(auVar162);
          auVar209 = ZEXT1664(auVar158);
          local_98 = ZEXT1632(auVar177);
          local_1b8 = ZEXT1632(auVar159);
          local_138 = ZEXT1632(auVar160);
          local_198 = ZEXT1632(auVar161);
          local_178 = ZEXT1632(auVar162);
          local_158 = ZEXT1632(auVar158);
          if (iVar144 <= iVar152 + 7) break;
          auVar185 = *(undefined1 (*) [32])(*local_368 + lVar143 * 2);
          auVar158 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar143 + sVar10 * uVar140 * lVar142));
          auVar177 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar143 + sVar10 * lVar141 * lVar142));
          auVar159 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar143 + sVar10 * lVar145 * lVar142));
          auVar160 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar143 + sVar10 * lVar148 * lVar142));
          auVar161 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar143 + sVar10 * lVar150 * lVar142));
          auVar162 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar143 + sVar10 * lVar153 * lVar142));
          auVar163 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar143 + sVar10 * lVar155 * lVar142));
          auVar164 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar143 + sVar10 * lVar157 * lVar142));
          auVar186 = vcvtph2ps_f16c(auVar158);
          auVar187 = vcvtph2ps_f16c(auVar177);
          auVar188 = vcvtph2ps_f16c(auVar159);
          auVar189 = vcvtph2ps_f16c(auVar160);
          auVar190 = vcvtph2ps_f16c(auVar161);
          auVar191 = vcvtph2ps_f16c(auVar162);
          auVar192 = vcvtph2ps_f16c(auVar163);
          local_218 = vfmadd231ps_avx512vl(local_218,auVar185,auVar186);
          local_1f8._0_16_ = vfmadd231ps_fma(local_1f8,auVar185,auVar187);
          auVar177 = vfmadd231ps_fma(local_98,auVar185,auVar188);
          auVar159 = vfmadd231ps_fma(local_1b8,auVar185,auVar189);
          auVar186 = vcvtph2ps_f16c(auVar164);
          auVar160 = vfmadd231ps_fma(local_138,auVar185,auVar190);
          auVar161 = vfmadd231ps_fma(local_198,auVar185,auVar191);
          auVar162 = vfmadd231ps_fma(local_178,auVar185,auVar192);
          auVar158 = vfmadd231ps_fma(local_158,auVar185,auVar186);
          iVar152 = iVar152 + 8;
          lVar143 = lVar143 + 0x10;
          lVar156 = lVar156 + 8;
        }
        lVar142 = sVar10 * lVar142;
        local_318 = lVar157;
        local_310 = lVar155;
        local_308 = lVar153;
        local_300 = lVar150;
        local_2f8 = lVar148;
        local_2f0 = lVar145;
        local_1c8 = uVar138;
        local_1c0 = lVar141;
        for (; (int)lVar156 < iVar144; lVar156 = lVar156 + 1) {
          local_238 = auVar208._0_32_;
          puVar1 = (unsigned_short *)((long)pvVar9 + lVar156 * 2 + lVar142 * uVar140);
          local_248 = ZEXT416(*(uint *)(*pauVar149 + lVar156 * 4));
          local_258 = float16_to_float32(*puVar1);
          local_268 = ZEXT416(*(uint *)(*pauVar149 + lVar156 * 4));
          uStack_254 = extraout_XMM0_Db;
          uStack_250 = extraout_XMM0_Dc;
          uStack_24c = extraout_XMM0_Dd;
          local_278 = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar142));
          local_288 = ZEXT416(*(uint *)(*pauVar149 + lVar156 * 4));
          fVar253 = float16_to_float32(puVar1[lVar142]);
          auVar185 = local_b8;
          local_b8._4_4_ = extraout_XMM0_Db_00;
          local_b8._0_4_ = fVar253;
          local_b8._8_4_ = extraout_XMM0_Dc_00;
          local_b8._16_16_ = auVar185._16_16_;
          local_b8._12_4_ = extraout_XMM0_Dd_00;
          local_d8._0_16_ = ZEXT416(*(uint *)(*pauVar149 + lVar156 * 4));
          fVar253 = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar142 * 3));
          auVar185 = local_f8;
          local_f8._4_4_ = extraout_XMM0_Db_01;
          local_f8._0_4_ = fVar253;
          local_f8._8_4_ = extraout_XMM0_Dc_01;
          local_f8._16_16_ = auVar185._16_16_;
          local_f8._12_4_ = extraout_XMM0_Dd_01;
          local_118._0_16_ = ZEXT416(*(uint *)(*pauVar149 + lVar156 * 4));
          local_298._0_4_ = float16_to_float32(puVar1[lVar142 * 2]);
          local_298._4_4_ = extraout_XMM0_Db_02;
          local_298._8_4_ = extraout_XMM0_Dc_02;
          local_298._12_4_ = extraout_XMM0_Dd_02;
          local_2a8 = ZEXT416(*(uint *)(*pauVar149 + lVar156 * 4));
          local_2b8._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar142 * 5));
          local_2b8._4_4_ = extraout_XMM0_Db_03;
          local_2b8._8_4_ = extraout_XMM0_Dc_03;
          local_2b8._12_4_ = extraout_XMM0_Dd_03;
          local_2c8 = ZEXT416(*(uint *)(*pauVar149 + lVar156 * 4));
          fVar253 = float16_to_float32(puVar1[lVar142 * 3]);
          local_2d8 = CONCAT44(extraout_XMM0_Db_04,fVar253);
          local_2e8 = ZEXT416(*(uint *)(*pauVar149 + lVar156 * 4));
          auVar208._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar142 * 7));
          auVar208._4_60_ = extraout_var;
          auVar158 = vinsertps_avx(local_298,ZEXT416((uint)local_2b8._0_4_),0x10);
          auVar158 = vinsertps_avx(auVar158,ZEXT416((uint)local_2d8),0x20);
          auVar158 = vinsertps_avx(auVar158,auVar208._0_16_,0x30);
          auVar177._4_4_ = uStack_254;
          auVar177._0_4_ = local_258;
          auVar177._8_4_ = uStack_250;
          auVar177._12_4_ = uStack_24c;
          auVar177 = vinsertps_avx(auVar177,ZEXT416((uint)local_278),0x10);
          auVar177 = vinsertps_avx(auVar177,ZEXT416((uint)local_b8._0_4_),0x20);
          auVar177 = vinsertps_avx(auVar177,ZEXT416((uint)local_f8._0_4_),0x30);
          auVar185._16_16_ = auVar158;
          auVar185._0_16_ = auVar177;
          auVar158 = vinsertps_avx(local_118._0_16_,ZEXT416((uint)local_2a8._0_4_),0x10);
          auVar158 = vinsertps_avx(auVar158,ZEXT416((uint)local_2c8._0_4_),0x20);
          auVar158 = vinsertps_avx(auVar158,ZEXT416((uint)local_2e8._0_4_),0x30);
          auVar177 = vinsertps_avx(local_248,ZEXT416((uint)local_268._0_4_),0x10);
          auVar177 = vinsertps_avx(auVar177,ZEXT416((uint)local_288._0_4_),0x20);
          auVar177 = vinsertps_avx(auVar177,ZEXT416((uint)local_d8._0_4_),0x30);
          auVar186._16_16_ = auVar158;
          auVar186._0_16_ = auVar177;
          auVar158 = vfmadd231ps_fma(local_238,auVar185,auVar186);
          auVar208 = ZEXT1664(auVar158);
          auVar209 = ZEXT3264(local_158);
          auVar210 = ZEXT3264(local_178);
          auVar211 = ZEXT3264(local_198);
          auVar212 = ZEXT3264(local_138);
          auVar213 = ZEXT3264(local_1b8);
          auVar214 = ZEXT3264(local_98);
        }
        auVar185 = vhaddps_avx(local_218,local_1f8);
        auVar186 = vhaddps_avx(auVar214._0_32_,auVar213._0_32_);
        auVar186 = vhaddps_avx(auVar185,auVar186);
        auVar185 = vhaddps_avx(auVar212._0_32_,auVar211._0_32_);
        auVar187 = vhaddps_avx(auVar210._0_32_,auVar209._0_32_);
        auVar187 = vhaddps_avx(auVar185,auVar187);
        auVar185 = vblendps_avx(auVar186,auVar187,0xf0);
        auVar186 = vperm2f128_avx(auVar186,auVar187,0x21);
        auVar188._0_4_ = auVar208._0_4_ + auVar186._0_4_ + auVar185._0_4_;
        auVar188._4_4_ = auVar208._4_4_ + auVar186._4_4_ + auVar185._4_4_;
        auVar188._8_4_ = auVar208._8_4_ + auVar186._8_4_ + auVar185._8_4_;
        auVar188._12_4_ = auVar208._12_4_ + auVar186._12_4_ + auVar185._12_4_;
        auVar188._16_4_ = auVar208._16_4_ + auVar186._16_4_ + auVar185._16_4_;
        auVar188._20_4_ = auVar208._20_4_ + auVar186._20_4_ + auVar185._20_4_;
        auVar188._24_4_ = auVar208._24_4_ + auVar186._24_4_ + auVar185._24_4_;
        auVar188._28_4_ = auVar208._28_4_ + auVar186._28_4_ + auVar185._28_4_;
        auVar187 = auVar188;
        if (5 < iVar136 - 1U) goto switchD_0029d15a_caseD_1;
        auVar187 = vmaxps_avx(auVar188,ZEXT832(0) << 0x20);
        switch(iVar136) {
        case 2:
          auVar185 = vminps_avx(auVar188,ZEXT832(0) << 0x20);
          uVar2 = *(this->super_InnerProduct).activation_params.data;
          auVar109._4_4_ = uVar2;
          auVar109._0_4_ = uVar2;
          auVar109._8_4_ = uVar2;
          auVar109._12_4_ = uVar2;
          auVar109._16_4_ = uVar2;
          auVar109._20_4_ = uVar2;
          auVar109._24_4_ = uVar2;
          auVar109._28_4_ = uVar2;
          auVar187 = vfmadd231ps_avx512vl(auVar187,auVar185,auVar109);
          break;
        case 3:
          puVar11 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar2 = *puVar11;
          auVar107._4_4_ = uVar2;
          auVar107._0_4_ = uVar2;
          auVar107._8_4_ = uVar2;
          auVar107._12_4_ = uVar2;
          auVar107._16_4_ = uVar2;
          auVar107._20_4_ = uVar2;
          auVar107._24_4_ = uVar2;
          auVar107._28_4_ = uVar2;
          auVar185 = vmaxps_avx512vl(auVar188,auVar107);
          uVar2 = puVar11[1];
          auVar108._4_4_ = uVar2;
          auVar108._0_4_ = uVar2;
          auVar108._8_4_ = uVar2;
          auVar108._12_4_ = uVar2;
          auVar108._16_4_ = uVar2;
          auVar108._20_4_ = uVar2;
          auVar108._24_4_ = uVar2;
          auVar108._28_4_ = uVar2;
          auVar187 = vminps_avx512vl(auVar185,auVar108);
          break;
        case 4:
          auVar96._8_4_ = 0x80000000;
          auVar96._0_8_ = 0x8000000080000000;
          auVar96._12_4_ = 0x80000000;
          auVar96._16_4_ = 0x80000000;
          auVar96._20_4_ = 0x80000000;
          auVar96._24_4_ = 0x80000000;
          auVar96._28_4_ = 0x80000000;
          auVar185 = vxorps_avx512vl(auVar188,auVar96);
          auVar97._8_4_ = 0x42b0c0a5;
          auVar97._0_8_ = 0x42b0c0a542b0c0a5;
          auVar97._12_4_ = 0x42b0c0a5;
          auVar97._16_4_ = 0x42b0c0a5;
          auVar97._20_4_ = 0x42b0c0a5;
          auVar97._24_4_ = 0x42b0c0a5;
          auVar97._28_4_ = 0x42b0c0a5;
          auVar185 = vminps_avx512vl(auVar185,auVar97);
          auVar98._8_4_ = 0xc2b0c0a5;
          auVar98._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar98._12_4_ = 0xc2b0c0a5;
          auVar98._16_4_ = 0xc2b0c0a5;
          auVar98._20_4_ = 0xc2b0c0a5;
          auVar98._24_4_ = 0xc2b0c0a5;
          auVar98._28_4_ = 0xc2b0c0a5;
          auVar186 = vmaxps_avx512vl(auVar185,auVar98);
          auVar288._8_4_ = 0x3f000000;
          auVar288._0_8_ = 0x3f0000003f000000;
          auVar288._12_4_ = 0x3f000000;
          auVar288._16_4_ = 0x3f000000;
          auVar288._20_4_ = 0x3f000000;
          auVar288._24_4_ = 0x3f000000;
          auVar288._28_4_ = 0x3f000000;
          auVar99._8_4_ = 0x3fb8aa3b;
          auVar99._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar99._12_4_ = 0x3fb8aa3b;
          auVar99._16_4_ = 0x3fb8aa3b;
          auVar99._20_4_ = 0x3fb8aa3b;
          auVar99._24_4_ = 0x3fb8aa3b;
          auVar99._28_4_ = 0x3fb8aa3b;
          auVar187 = vfmadd231ps_avx512vl(auVar288,auVar186,auVar99);
          auVar185 = vroundps_avx(auVar187,1);
          uVar138 = vcmpps_avx512vl(auVar187,auVar185,1);
          auVar293._8_4_ = 0x3f800000;
          auVar293._0_8_ = 0x3f8000003f800000;
          auVar293._12_4_ = 0x3f800000;
          auVar293._16_4_ = 0x3f800000;
          auVar293._20_4_ = 0x3f800000;
          auVar293._24_4_ = 0x3f800000;
          auVar293._28_4_ = 0x3f800000;
          auVar188 = vsubps_avx512vl(auVar185,auVar293);
          bVar14 = (bool)((byte)uVar138 & 1);
          auVar207._0_4_ = (float)((uint)bVar14 * auVar188._0_4_ | (uint)!bVar14 * auVar185._0_4_);
          bVar14 = (bool)((byte)(uVar138 >> 1) & 1);
          auVar207._4_4_ = (float)((uint)bVar14 * auVar188._4_4_ | (uint)!bVar14 * auVar185._4_4_);
          bVar14 = (bool)((byte)(uVar138 >> 2) & 1);
          auVar207._8_4_ = (float)((uint)bVar14 * auVar188._8_4_ | (uint)!bVar14 * auVar185._8_4_);
          bVar14 = (bool)((byte)(uVar138 >> 3) & 1);
          auVar207._12_4_ =
               (float)((uint)bVar14 * auVar188._12_4_ | (uint)!bVar14 * auVar185._12_4_);
          bVar14 = (bool)((byte)(uVar138 >> 4) & 1);
          auVar207._16_4_ =
               (float)((uint)bVar14 * auVar188._16_4_ | (uint)!bVar14 * auVar185._16_4_);
          bVar14 = (bool)((byte)(uVar138 >> 5) & 1);
          auVar207._20_4_ =
               (float)((uint)bVar14 * auVar188._20_4_ | (uint)!bVar14 * auVar185._20_4_);
          bVar14 = (bool)((byte)(uVar138 >> 6) & 1);
          auVar207._24_4_ =
               (float)((uint)bVar14 * auVar188._24_4_ | (uint)!bVar14 * auVar185._24_4_);
          bVar14 = SUB81(uVar138 >> 7,0);
          auVar207._28_4_ =
               (float)((uint)bVar14 * auVar188._28_4_ | (uint)!bVar14 * auVar185._28_4_);
          auVar100._8_4_ = 0x3f318000;
          auVar100._0_8_ = 0x3f3180003f318000;
          auVar100._12_4_ = 0x3f318000;
          auVar100._16_4_ = 0x3f318000;
          auVar100._20_4_ = 0x3f318000;
          auVar100._24_4_ = 0x3f318000;
          auVar100._28_4_ = 0x3f318000;
          auVar185 = vfmsub231ps_avx512vl(auVar186,auVar207,auVar100);
          auVar101._8_4_ = 0x395e8083;
          auVar101._0_8_ = 0x395e8083395e8083;
          auVar101._12_4_ = 0x395e8083;
          auVar101._16_4_ = 0x395e8083;
          auVar101._20_4_ = 0x395e8083;
          auVar101._24_4_ = 0x395e8083;
          auVar101._28_4_ = 0x395e8083;
          auVar185 = vfmsub231ps_avx512vl(auVar185,auVar207,auVar101);
          auVar123._4_4_ = auVar185._4_4_ * auVar185._4_4_;
          auVar123._0_4_ = auVar185._0_4_ * auVar185._0_4_;
          auVar123._8_4_ = auVar185._8_4_ * auVar185._8_4_;
          auVar123._12_4_ = auVar185._12_4_ * auVar185._12_4_;
          auVar123._16_4_ = auVar185._16_4_ * auVar185._16_4_;
          auVar123._20_4_ = auVar185._20_4_ * auVar185._20_4_;
          auVar123._24_4_ = auVar185._24_4_ * auVar185._24_4_;
          auVar123._28_4_ = auVar187._28_4_;
          auVar279._8_4_ = 0x39506967;
          auVar279._0_8_ = 0x3950696739506967;
          auVar279._12_4_ = 0x39506967;
          auVar279._16_4_ = 0x39506967;
          auVar279._20_4_ = 0x39506967;
          auVar279._24_4_ = 0x39506967;
          auVar279._28_4_ = 0x39506967;
          auVar102._8_4_ = 0x3ab743ce;
          auVar102._0_8_ = 0x3ab743ce3ab743ce;
          auVar102._12_4_ = 0x3ab743ce;
          auVar102._16_4_ = 0x3ab743ce;
          auVar102._20_4_ = 0x3ab743ce;
          auVar102._24_4_ = 0x3ab743ce;
          auVar102._28_4_ = 0x3ab743ce;
          auVar186 = vfmadd213ps_avx512vl(auVar279,auVar185,auVar102);
          auVar103._8_4_ = 0x3c088908;
          auVar103._0_8_ = 0x3c0889083c088908;
          auVar103._12_4_ = 0x3c088908;
          auVar103._16_4_ = 0x3c088908;
          auVar103._20_4_ = 0x3c088908;
          auVar103._24_4_ = 0x3c088908;
          auVar103._28_4_ = 0x3c088908;
          auVar186 = vfmadd213ps_avx512vl(auVar186,auVar185,auVar103);
          auVar104._8_4_ = 0x3d2aa9c1;
          auVar104._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar104._12_4_ = 0x3d2aa9c1;
          auVar104._16_4_ = 0x3d2aa9c1;
          auVar104._20_4_ = 0x3d2aa9c1;
          auVar104._24_4_ = 0x3d2aa9c1;
          auVar104._28_4_ = 0x3d2aa9c1;
          auVar186 = vfmadd213ps_avx512vl(auVar186,auVar185,auVar104);
          auVar105._8_4_ = 0x3e2aaaaa;
          auVar105._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar105._12_4_ = 0x3e2aaaaa;
          auVar105._16_4_ = 0x3e2aaaaa;
          auVar105._20_4_ = 0x3e2aaaaa;
          auVar105._24_4_ = 0x3e2aaaaa;
          auVar105._28_4_ = 0x3e2aaaaa;
          auVar186 = vfmadd213ps_avx512vl(auVar186,auVar185,auVar105);
          auVar158 = vfmadd213ps_fma(auVar186,auVar185,auVar288);
          auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar123,auVar185);
          auVar231._0_4_ = auVar158._0_4_ + 1.0;
          auVar231._4_4_ = auVar158._4_4_ + 1.0;
          auVar231._8_4_ = auVar158._8_4_ + 1.0;
          auVar231._12_4_ = auVar158._12_4_ + 1.0;
          auVar231._16_4_ = 0x3f800000;
          auVar231._20_4_ = 0x3f800000;
          auVar231._24_4_ = 0x3f800000;
          auVar231._28_4_ = 0x3f800000;
          auVar252._0_4_ = (int)auVar207._0_4_;
          auVar252._4_4_ = (int)auVar207._4_4_;
          auVar252._8_4_ = (int)auVar207._8_4_;
          auVar252._12_4_ = (int)auVar207._12_4_;
          auVar252._16_4_ = (int)auVar207._16_4_;
          auVar252._20_4_ = (int)auVar207._20_4_;
          auVar252._24_4_ = (int)auVar207._24_4_;
          auVar252._28_4_ = (int)auVar207._28_4_;
          auVar185 = vpslld_avx2(auVar252,0x17);
          auVar106._8_4_ = 0x3f800000;
          auVar106._0_8_ = 0x3f8000003f800000;
          auVar106._12_4_ = 0x3f800000;
          auVar106._16_4_ = 0x3f800000;
          auVar106._20_4_ = 0x3f800000;
          auVar106._24_4_ = 0x3f800000;
          auVar106._28_4_ = 0x3f800000;
          auVar185 = vpaddd_avx512vl(auVar185,auVar106);
          auVar158 = vfmadd213ps_fma(auVar185,auVar231,auVar293);
          auVar187 = vdivps_avx(auVar293,ZEXT1632(auVar158));
          break;
        case 5:
          auVar297._8_4_ = 0x42b0c0a5;
          auVar297._0_8_ = 0x42b0c0a542b0c0a5;
          auVar297._12_4_ = 0x42b0c0a5;
          auVar297._16_4_ = 0x42b0c0a5;
          auVar297._20_4_ = 0x42b0c0a5;
          auVar297._24_4_ = 0x42b0c0a5;
          auVar297._28_4_ = 0x42b0c0a5;
          auVar185 = vminps_avx(auVar188,auVar297);
          auVar302._8_4_ = 0xc2b0c0a5;
          auVar302._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar302._12_4_ = 0xc2b0c0a5;
          auVar302._16_4_ = 0xc2b0c0a5;
          auVar302._20_4_ = 0xc2b0c0a5;
          auVar302._24_4_ = 0xc2b0c0a5;
          auVar302._28_4_ = 0xc2b0c0a5;
          auVar185 = vmaxps_avx(auVar185,auVar302);
          auVar310._8_4_ = 0x3fb8aa3b;
          auVar310._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar310._12_4_ = 0x3fb8aa3b;
          auVar310._16_4_ = 0x3fb8aa3b;
          auVar310._20_4_ = 0x3fb8aa3b;
          auVar310._24_4_ = 0x3fb8aa3b;
          auVar310._28_4_ = 0x3fb8aa3b;
          auVar306._8_4_ = 0x3f000000;
          auVar306._0_8_ = 0x3f0000003f000000;
          auVar306._12_4_ = 0x3f000000;
          auVar306._16_4_ = 0x3f000000;
          auVar306._20_4_ = 0x3f000000;
          auVar306._24_4_ = 0x3f000000;
          auVar306._28_4_ = 0x3f000000;
          auVar158 = vfmadd213ps_fma(auVar310,auVar185,auVar306);
          auVar186 = vroundps_avx(ZEXT1632(auVar158),1);
          uVar138 = vcmpps_avx512vl(ZEXT1632(auVar158),auVar186,1);
          auVar314._8_4_ = 0x3f800000;
          auVar314._0_8_ = 0x3f8000003f800000;
          auVar314._12_4_ = 0x3f800000;
          auVar314._16_4_ = 0x3f800000;
          auVar314._20_4_ = 0x3f800000;
          auVar314._24_4_ = 0x3f800000;
          auVar314._28_4_ = 0x3f800000;
          auVar187 = vsubps_avx512vl(auVar186,auVar314);
          bVar14 = (bool)((byte)uVar138 & 1);
          auVar268._0_4_ = (float)((uint)bVar14 * auVar187._0_4_ | (uint)!bVar14 * auVar186._0_4_);
          bVar14 = (bool)((byte)(uVar138 >> 1) & 1);
          auVar268._4_4_ = (float)((uint)bVar14 * auVar187._4_4_ | (uint)!bVar14 * auVar186._4_4_);
          bVar14 = (bool)((byte)(uVar138 >> 2) & 1);
          auVar268._8_4_ = (float)((uint)bVar14 * auVar187._8_4_ | (uint)!bVar14 * auVar186._8_4_);
          bVar14 = (bool)((byte)(uVar138 >> 3) & 1);
          auVar268._12_4_ =
               (float)((uint)bVar14 * auVar187._12_4_ | (uint)!bVar14 * auVar186._12_4_);
          bVar14 = (bool)((byte)(uVar138 >> 4) & 1);
          auVar268._16_4_ =
               (float)((uint)bVar14 * auVar187._16_4_ | (uint)!bVar14 * auVar186._16_4_);
          bVar14 = (bool)((byte)(uVar138 >> 5) & 1);
          auVar268._20_4_ =
               (float)((uint)bVar14 * auVar187._20_4_ | (uint)!bVar14 * auVar186._20_4_);
          bVar14 = (bool)((byte)(uVar138 >> 6) & 1);
          auVar268._24_4_ =
               (float)((uint)bVar14 * auVar187._24_4_ | (uint)!bVar14 * auVar186._24_4_);
          bVar14 = SUB81(uVar138 >> 7,0);
          auVar268._28_4_ =
               (float)((uint)bVar14 * auVar187._28_4_ | (uint)!bVar14 * auVar186._28_4_);
          auVar318._8_4_ = 0x3f318000;
          auVar318._0_8_ = 0x3f3180003f318000;
          auVar318._12_4_ = 0x3f318000;
          auVar318._16_4_ = 0x3f318000;
          auVar318._20_4_ = 0x3f318000;
          auVar318._24_4_ = 0x3f318000;
          auVar318._28_4_ = 0x3f318000;
          auVar158 = vfmsub231ps_fma(auVar185,auVar268,auVar318);
          auVar187 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar185 = vfnmsub231ps_avx512vl(ZEXT1632(auVar158),auVar268,auVar187);
          auVar266._0_4_ = auVar185._0_4_ * auVar185._0_4_;
          auVar266._4_4_ = auVar185._4_4_ * auVar185._4_4_;
          auVar266._8_4_ = auVar185._8_4_ * auVar185._8_4_;
          auVar266._12_4_ = auVar185._12_4_ * auVar185._12_4_;
          auVar266._16_4_ = auVar185._16_4_ * auVar185._16_4_;
          auVar266._20_4_ = auVar185._20_4_ * auVar185._20_4_;
          auVar266._24_4_ = auVar185._24_4_ * auVar185._24_4_;
          auVar266._28_4_ = 0;
          auVar322._8_4_ = 0x39506967;
          auVar322._0_8_ = 0x3950696739506967;
          auVar322._12_4_ = 0x39506967;
          auVar322._16_4_ = 0x39506967;
          auVar322._20_4_ = 0x39506967;
          auVar322._24_4_ = 0x39506967;
          auVar322._28_4_ = 0x39506967;
          auVar326._8_4_ = 0x3ab743ce;
          auVar326._0_8_ = 0x3ab743ce3ab743ce;
          auVar326._12_4_ = 0x3ab743ce;
          auVar326._16_4_ = 0x3ab743ce;
          auVar326._20_4_ = 0x3ab743ce;
          auVar326._24_4_ = 0x3ab743ce;
          auVar326._28_4_ = 0x3ab743ce;
          auVar158 = vfmadd213ps_fma(auVar322,auVar185,auVar326);
          auVar330._8_4_ = 0x3c088908;
          auVar330._0_8_ = 0x3c0889083c088908;
          auVar330._12_4_ = 0x3c088908;
          auVar330._16_4_ = 0x3c088908;
          auVar330._20_4_ = 0x3c088908;
          auVar330._24_4_ = 0x3c088908;
          auVar330._28_4_ = 0x3c088908;
          auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar185,auVar330);
          auVar333._8_4_ = 0x3d2aa9c1;
          auVar333._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar333._12_4_ = 0x3d2aa9c1;
          auVar333._16_4_ = 0x3d2aa9c1;
          auVar333._20_4_ = 0x3d2aa9c1;
          auVar333._24_4_ = 0x3d2aa9c1;
          auVar333._28_4_ = 0x3d2aa9c1;
          auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar185,auVar333);
          auVar189 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar186 = vfmadd213ps_avx512vl(ZEXT1632(auVar158),auVar185,auVar189);
          auVar158 = vfmadd213ps_fma(auVar186,auVar185,auVar306);
          auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar266,auVar185);
          auVar250._0_4_ = auVar158._0_4_ + 1.0;
          auVar250._4_4_ = auVar158._4_4_ + 1.0;
          auVar250._8_4_ = auVar158._8_4_ + 1.0;
          auVar250._12_4_ = auVar158._12_4_ + 1.0;
          auVar250._16_4_ = 0x3f800000;
          auVar250._20_4_ = 0x3f800000;
          auVar250._24_4_ = 0x3f800000;
          auVar250._28_4_ = 0x3f800000;
          auVar267._0_4_ = (int)auVar268._0_4_;
          auVar267._4_4_ = (int)auVar268._4_4_;
          auVar267._8_4_ = (int)auVar268._8_4_;
          auVar267._12_4_ = (int)auVar268._12_4_;
          auVar267._16_4_ = (int)auVar268._16_4_;
          auVar267._20_4_ = (int)auVar268._20_4_;
          auVar267._24_4_ = (int)auVar268._24_4_;
          auVar267._28_4_ = (int)auVar268._28_4_;
          auVar185 = vpslld_avx2(auVar267,0x17);
          auVar190 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          auVar185 = vpaddd_avx512vl(auVar185,auVar190);
          auVar158 = vfmadd213ps_fma(auVar185,auVar250,auVar314);
          uVar138 = vcmpps_avx512vl(ZEXT1632(auVar158),ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar192._8_4_ = 0x800000;
          auVar192._0_8_ = 0x80000000800000;
          auVar192._12_4_ = 0x800000;
          auVar192._16_4_ = 0x800000;
          auVar192._20_4_ = 0x800000;
          auVar192._24_4_ = 0x800000;
          auVar192._28_4_ = 0x800000;
          auVar185 = vmaxps_avx512vl(ZEXT1632(auVar158),auVar192);
          auVar268 = vpsrld_avx2(auVar185,0x17);
          auVar278._8_4_ = 0x807fffff;
          auVar278._0_8_ = 0x807fffff807fffff;
          auVar278._12_4_ = 0x807fffff;
          auVar278._16_4_ = 0x807fffff;
          auVar278._20_4_ = 0x807fffff;
          auVar278._24_4_ = 0x807fffff;
          auVar278._28_4_ = 0x807fffff;
          auVar195._8_4_ = 0x3f000000;
          auVar195._0_8_ = 0x3f0000003f000000;
          auVar195._12_4_ = 0x3f000000;
          auVar195._16_4_ = 0x3f000000;
          auVar195._20_4_ = 0x3f000000;
          auVar195._24_4_ = 0x3f000000;
          auVar195._28_4_ = 0x3f000000;
          auVar185 = vpternlogd_avx512vl(auVar185,auVar278,auVar195,0xea);
          auVar196._8_4_ = 0x3f3504f3;
          auVar196._0_8_ = 0x3f3504f33f3504f3;
          auVar196._12_4_ = 0x3f3504f3;
          auVar196._16_4_ = 0x3f3504f3;
          auVar196._20_4_ = 0x3f3504f3;
          auVar196._24_4_ = 0x3f3504f3;
          auVar196._28_4_ = 0x3f3504f3;
          uVar16 = vcmpps_avx512vl(auVar185,auVar196,1);
          auVar191 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar186 = vaddps_avx512vl(auVar185,auVar191);
          auVar192 = vaddps_avx512vl(auVar186,auVar185);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar203._0_4_ = (float)((uint)bVar14 * auVar192._0_4_ | (uint)!bVar14 * auVar186._0_4_);
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar203._4_4_ = (float)((uint)bVar14 * auVar192._4_4_ | (uint)!bVar14 * auVar186._4_4_);
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar203._8_4_ = (float)((uint)bVar14 * auVar192._8_4_ | (uint)!bVar14 * auVar186._8_4_);
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar203._12_4_ =
               (float)((uint)bVar14 * auVar192._12_4_ | (uint)!bVar14 * auVar186._12_4_);
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar203._16_4_ =
               (float)((uint)bVar14 * auVar192._16_4_ | (uint)!bVar14 * auVar186._16_4_);
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar203._20_4_ =
               (float)((uint)bVar14 * auVar192._20_4_ | (uint)!bVar14 * auVar186._20_4_);
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar203._24_4_ =
               (float)((uint)bVar14 * auVar192._24_4_ | (uint)!bVar14 * auVar186._24_4_);
          bVar14 = SUB81(uVar16 >> 7,0);
          auVar203._28_4_ = (uint)bVar14 * auVar192._28_4_ | (uint)!bVar14 * auVar186._28_4_;
          auVar121._4_4_ = auVar203._4_4_ * auVar203._4_4_;
          auVar121._0_4_ = auVar203._0_4_ * auVar203._0_4_;
          auVar121._8_4_ = auVar203._8_4_ * auVar203._8_4_;
          auVar121._12_4_ = auVar203._12_4_ * auVar203._12_4_;
          auVar121._16_4_ = auVar203._16_4_ * auVar203._16_4_;
          auVar121._20_4_ = auVar203._20_4_ * auVar203._20_4_;
          auVar121._24_4_ = auVar203._24_4_ * auVar203._24_4_;
          auVar121._28_4_ = auVar185._28_4_;
          auVar287._8_4_ = 0x3d9021bb;
          auVar287._0_8_ = 0x3d9021bb3d9021bb;
          auVar287._12_4_ = 0x3d9021bb;
          auVar287._16_4_ = 0x3d9021bb;
          auVar287._20_4_ = 0x3d9021bb;
          auVar287._24_4_ = 0x3d9021bb;
          auVar287._28_4_ = 0x3d9021bb;
          auVar193._8_4_ = 0xbdebd1b8;
          auVar193._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar193._12_4_ = 0xbdebd1b8;
          auVar193._16_4_ = 0xbdebd1b8;
          auVar193._20_4_ = 0xbdebd1b8;
          auVar193._24_4_ = 0xbdebd1b8;
          auVar193._28_4_ = 0xbdebd1b8;
          auVar185 = vfmadd213ps_avx512vl(auVar287,auVar203,auVar193);
          auVar194._8_4_ = 0x3def251a;
          auVar194._0_8_ = 0x3def251a3def251a;
          auVar194._12_4_ = 0x3def251a;
          auVar194._16_4_ = 0x3def251a;
          auVar194._20_4_ = 0x3def251a;
          auVar194._24_4_ = 0x3def251a;
          auVar194._28_4_ = 0x3def251a;
          auVar185 = vfmadd213ps_avx512vl(auVar185,auVar203,auVar194);
          auVar89._8_4_ = 0xbdfe5d4f;
          auVar89._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar89._12_4_ = 0xbdfe5d4f;
          auVar89._16_4_ = 0xbdfe5d4f;
          auVar89._20_4_ = 0xbdfe5d4f;
          auVar89._24_4_ = 0xbdfe5d4f;
          auVar89._28_4_ = 0xbdfe5d4f;
          auVar185 = vfmadd213ps_avx512vl(auVar185,auVar203,auVar89);
          auVar90._8_4_ = 0x3e11e9bf;
          auVar90._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar90._12_4_ = 0x3e11e9bf;
          auVar90._16_4_ = 0x3e11e9bf;
          auVar90._20_4_ = 0x3e11e9bf;
          auVar90._24_4_ = 0x3e11e9bf;
          auVar90._28_4_ = 0x3e11e9bf;
          auVar185 = vfmadd213ps_avx512vl(auVar185,auVar203,auVar90);
          auVar91._8_4_ = 0xbe2aae50;
          auVar91._0_8_ = 0xbe2aae50be2aae50;
          auVar91._12_4_ = 0xbe2aae50;
          auVar91._16_4_ = 0xbe2aae50;
          auVar91._20_4_ = 0xbe2aae50;
          auVar91._24_4_ = 0xbe2aae50;
          auVar91._28_4_ = 0xbe2aae50;
          auVar185 = vfmadd213ps_avx512vl(auVar185,auVar203,auVar91);
          auVar92._8_4_ = 0x3e4cceac;
          auVar92._0_8_ = 0x3e4cceac3e4cceac;
          auVar92._12_4_ = 0x3e4cceac;
          auVar92._16_4_ = 0x3e4cceac;
          auVar92._20_4_ = 0x3e4cceac;
          auVar92._24_4_ = 0x3e4cceac;
          auVar92._28_4_ = 0x3e4cceac;
          auVar185 = vfmadd213ps_avx512vl(auVar185,auVar203,auVar92);
          auVar93._8_4_ = 0xbe7ffffc;
          auVar93._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar93._12_4_ = 0xbe7ffffc;
          auVar93._16_4_ = 0xbe7ffffc;
          auVar93._20_4_ = 0xbe7ffffc;
          auVar93._24_4_ = 0xbe7ffffc;
          auVar93._28_4_ = 0xbe7ffffc;
          auVar185 = vfmadd213ps_avx512vl(auVar185,auVar203,auVar93);
          auVar94._8_4_ = 0x3eaaaaaa;
          auVar94._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar94._12_4_ = 0x3eaaaaaa;
          auVar94._16_4_ = 0x3eaaaaaa;
          auVar94._20_4_ = 0x3eaaaaaa;
          auVar94._24_4_ = 0x3eaaaaaa;
          auVar94._28_4_ = 0x3eaaaaaa;
          auVar185 = vfmadd213ps_avx512vl(auVar185,auVar203,auVar94);
          auVar122._4_4_ = auVar203._4_4_ * auVar203._4_4_ * auVar203._4_4_ * auVar185._4_4_;
          auVar122._0_4_ = auVar203._0_4_ * auVar203._0_4_ * auVar203._0_4_ * auVar185._0_4_;
          auVar122._8_4_ = auVar203._8_4_ * auVar203._8_4_ * auVar203._8_4_ * auVar185._8_4_;
          auVar122._12_4_ = auVar203._12_4_ * auVar203._12_4_ * auVar203._12_4_ * auVar185._12_4_;
          auVar122._16_4_ = auVar203._16_4_ * auVar203._16_4_ * auVar203._16_4_ * auVar185._16_4_;
          auVar122._20_4_ = auVar203._20_4_ * auVar203._20_4_ * auVar203._20_4_ * auVar185._20_4_;
          auVar122._24_4_ = auVar203._24_4_ * auVar203._24_4_ * auVar203._24_4_ * auVar185._24_4_;
          auVar122._28_4_ = auVar185._28_4_;
          auVar95._8_4_ = 0xffffff82;
          auVar95._0_8_ = 0xffffff82ffffff82;
          auVar95._12_4_ = 0xffffff82;
          auVar95._16_4_ = 0xffffff82;
          auVar95._20_4_ = 0xffffff82;
          auVar95._24_4_ = 0xffffff82;
          auVar95._28_4_ = 0xffffff82;
          auVar185 = vpaddd_avx512vl(auVar268,auVar95);
          auVar185 = vcvtdq2ps_avx(auVar185);
          auVar186 = vsubps_avx512vl(auVar185,auVar314);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar204._0_4_ = (uint)bVar14 * auVar186._0_4_ | (uint)!bVar14 * auVar185._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar204._4_4_ = (uint)bVar14 * auVar186._4_4_ | (uint)!bVar14 * auVar185._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar204._8_4_ = (uint)bVar14 * auVar186._8_4_ | (uint)!bVar14 * auVar185._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar204._12_4_ = (uint)bVar14 * auVar186._12_4_ | (uint)!bVar14 * auVar185._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar204._16_4_ = (uint)bVar14 * auVar186._16_4_ | (uint)!bVar14 * auVar185._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar204._20_4_ = (uint)bVar14 * auVar186._20_4_ | (uint)!bVar14 * auVar185._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar204._24_4_ = (uint)bVar14 * auVar186._24_4_ | (uint)!bVar14 * auVar185._24_4_;
          bVar14 = SUB81(uVar16 >> 7,0);
          auVar204._28_4_ = (uint)bVar14 * auVar186._28_4_ | (uint)!bVar14 * auVar185._28_4_;
          auVar185 = vfmadd231ps_avx512vl(auVar122,auVar204,auVar187);
          auVar158 = vfmsub231ps_fma(auVar185,auVar306,auVar121);
          auVar185 = vsubps_avx(ZEXT1632(auVar158),auVar203);
          auVar158 = vfmsub231ps_fma(auVar185,auVar318,auVar204);
          auVar292._8_4_ = 0xc0000000;
          auVar292._0_8_ = 0xc0000000c0000000;
          auVar292._12_4_ = 0xc0000000;
          auVar292._16_4_ = 0xc0000000;
          auVar292._20_4_ = 0xc0000000;
          auVar292._24_4_ = 0xc0000000;
          auVar292._28_4_ = 0xc0000000;
          auVar185 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar14 = (bool)((byte)uVar138 & 1);
          auVar205._0_4_ =
               (uint)bVar14 * auVar185._0_4_ | (uint)!bVar14 * (int)(auVar158._0_4_ * -2.0);
          bVar14 = (bool)((byte)(uVar138 >> 1) & 1);
          auVar205._4_4_ =
               (uint)bVar14 * auVar185._4_4_ | (uint)!bVar14 * (int)(auVar158._4_4_ * -2.0);
          bVar14 = (bool)((byte)(uVar138 >> 2) & 1);
          auVar205._8_4_ =
               (uint)bVar14 * auVar185._8_4_ | (uint)!bVar14 * (int)(auVar158._8_4_ * -2.0);
          bVar14 = (bool)((byte)(uVar138 >> 3) & 1);
          auVar205._12_4_ =
               (uint)bVar14 * auVar185._12_4_ | (uint)!bVar14 * (int)(auVar158._12_4_ * -2.0);
          bVar14 = (bool)((byte)(uVar138 >> 4) & 1);
          auVar205._16_4_ = (uint)bVar14 * auVar185._16_4_ | (uint)!bVar14 * -0x80000000;
          bVar14 = (bool)((byte)(uVar138 >> 5) & 1);
          auVar205._20_4_ = (uint)bVar14 * auVar185._20_4_ | (uint)!bVar14 * -0x80000000;
          bVar14 = (bool)((byte)(uVar138 >> 6) & 1);
          auVar205._24_4_ = (uint)bVar14 * auVar185._24_4_ | (uint)!bVar14 * -0x80000000;
          auVar205._28_4_ = (uint)(byte)(uVar138 >> 7) * auVar185._28_4_;
          auVar185 = vminps_avx(auVar205,auVar297);
          auVar185 = vmaxps_avx(auVar185,auVar302);
          auVar158 = vfmadd213ps_fma(auVar310,auVar185,auVar306);
          auVar186 = vroundps_avx(ZEXT1632(auVar158),1);
          uVar138 = vcmpps_avx512vl(ZEXT1632(auVar158),auVar186,1);
          auVar192 = vsubps_avx512vl(auVar186,auVar314);
          bVar14 = (bool)((byte)uVar138 & 1);
          auVar206._0_4_ = (float)((uint)bVar14 * auVar192._0_4_ | (uint)!bVar14 * auVar186._0_4_);
          bVar14 = (bool)((byte)(uVar138 >> 1) & 1);
          auVar206._4_4_ = (float)((uint)bVar14 * auVar192._4_4_ | (uint)!bVar14 * auVar186._4_4_);
          bVar14 = (bool)((byte)(uVar138 >> 2) & 1);
          auVar206._8_4_ = (float)((uint)bVar14 * auVar192._8_4_ | (uint)!bVar14 * auVar186._8_4_);
          bVar14 = (bool)((byte)(uVar138 >> 3) & 1);
          auVar206._12_4_ =
               (float)((uint)bVar14 * auVar192._12_4_ | (uint)!bVar14 * auVar186._12_4_);
          bVar14 = (bool)((byte)(uVar138 >> 4) & 1);
          auVar206._16_4_ =
               (float)((uint)bVar14 * auVar192._16_4_ | (uint)!bVar14 * auVar186._16_4_);
          bVar14 = (bool)((byte)(uVar138 >> 5) & 1);
          auVar206._20_4_ =
               (float)((uint)bVar14 * auVar192._20_4_ | (uint)!bVar14 * auVar186._20_4_);
          bVar14 = (bool)((byte)(uVar138 >> 6) & 1);
          auVar206._24_4_ =
               (float)((uint)bVar14 * auVar192._24_4_ | (uint)!bVar14 * auVar186._24_4_);
          bVar14 = SUB81(uVar138 >> 7,0);
          auVar206._28_4_ =
               (float)((uint)bVar14 * auVar192._28_4_ | (uint)!bVar14 * auVar186._28_4_);
          auVar158 = vfmsub231ps_fma(auVar185,auVar206,auVar318);
          auVar185 = vfnmsub231ps_avx512vl(ZEXT1632(auVar158),auVar206,auVar187);
          auVar269._0_4_ = auVar185._0_4_ * auVar185._0_4_;
          auVar269._4_4_ = auVar185._4_4_ * auVar185._4_4_;
          auVar269._8_4_ = auVar185._8_4_ * auVar185._8_4_;
          auVar269._12_4_ = auVar185._12_4_ * auVar185._12_4_;
          auVar269._16_4_ = auVar185._16_4_ * auVar185._16_4_;
          auVar269._20_4_ = auVar185._20_4_ * auVar185._20_4_;
          auVar269._24_4_ = auVar185._24_4_ * auVar185._24_4_;
          auVar269._28_4_ = 0;
          auVar158 = vfmadd213ps_fma(auVar322,auVar185,auVar326);
          auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar185,auVar330);
          auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar185,auVar333);
          auVar186 = vfmadd213ps_avx512vl(ZEXT1632(auVar158),auVar185,auVar189);
          auVar158 = vfmadd213ps_fma(auVar186,auVar185,auVar306);
          auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar269,auVar185);
          auVar251._0_4_ = auVar158._0_4_ + 1.0;
          auVar251._4_4_ = auVar158._4_4_ + 1.0;
          auVar251._8_4_ = auVar158._8_4_ + 1.0;
          auVar251._12_4_ = auVar158._12_4_ + 1.0;
          auVar251._16_4_ = 0x3f800000;
          auVar251._20_4_ = 0x3f800000;
          auVar251._24_4_ = 0x3f800000;
          auVar251._28_4_ = 0x3f800000;
          auVar270._0_4_ = (int)auVar206._0_4_;
          auVar270._4_4_ = (int)auVar206._4_4_;
          auVar270._8_4_ = (int)auVar206._8_4_;
          auVar270._12_4_ = (int)auVar206._12_4_;
          auVar270._16_4_ = (int)auVar206._16_4_;
          auVar270._20_4_ = (int)auVar206._20_4_;
          auVar270._24_4_ = (int)auVar206._24_4_;
          auVar270._28_4_ = (int)auVar206._28_4_;
          auVar185 = vpslld_avx2(auVar270,0x17);
          auVar185 = vpaddd_avx512vl(auVar185,auVar190);
          auVar158 = vfmadd213ps_fma(auVar185,auVar251,auVar314);
          auVar185 = vdivps_avx(auVar314,ZEXT1632(auVar158));
          auVar185 = vfnmadd213ps_avx512vl(auVar185,auVar292,auVar191);
          goto LAB_0029d4c8;
        case 6:
          puVar11 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar2 = *puVar11;
          auVar191._4_4_ = uVar2;
          auVar191._0_4_ = uVar2;
          auVar191._8_4_ = uVar2;
          auVar191._12_4_ = uVar2;
          auVar191._16_4_ = uVar2;
          auVar191._20_4_ = uVar2;
          auVar191._24_4_ = uVar2;
          auVar191._28_4_ = uVar2;
          uVar2 = puVar11[1];
          auVar189._4_4_ = uVar2;
          auVar189._0_4_ = uVar2;
          auVar189._8_4_ = uVar2;
          auVar189._12_4_ = uVar2;
          auVar189._16_4_ = uVar2;
          auVar189._20_4_ = uVar2;
          auVar189._24_4_ = uVar2;
          auVar189._28_4_ = uVar2;
          auVar185 = vfmadd213ps_avx512vl(auVar191,auVar188,auVar189);
          auVar185 = vmaxps_avx(auVar185,ZEXT832(0) << 0x20);
          auVar190._8_4_ = 0x3f800000;
          auVar190._0_8_ = 0x3f8000003f800000;
          auVar190._12_4_ = 0x3f800000;
          auVar190._16_4_ = 0x3f800000;
          auVar190._20_4_ = 0x3f800000;
          auVar190._24_4_ = 0x3f800000;
          auVar190._28_4_ = 0x3f800000;
          auVar185 = vminps_avx512vl(auVar185,auVar190);
LAB_0029d4c8:
          auVar187._4_4_ = auVar185._4_4_ * auVar188._4_4_;
          auVar187._0_4_ = auVar185._0_4_ * auVar188._0_4_;
          auVar187._8_4_ = auVar185._8_4_ * auVar188._8_4_;
          auVar187._12_4_ = auVar185._12_4_ * auVar188._12_4_;
          auVar187._16_4_ = auVar185._16_4_ * auVar188._16_4_;
          auVar187._20_4_ = auVar185._20_4_ * auVar188._20_4_;
          auVar187._24_4_ = auVar185._24_4_ * auVar188._24_4_;
          auVar187._28_4_ = auVar185._28_4_;
        }
switchD_0029d15a_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + local_1d0 * 4) = auVar187;
        uVar140 = uVar140 + 8;
        lVar141 = local_1c0 + 8;
        lVar145 = local_2f0 + 8;
        lVar148 = local_2f8 + 8;
        lVar150 = local_300 + 8;
        lVar153 = local_308 + 8;
        lVar155 = local_310 + 8;
        lVar157 = local_318 + 8;
        uVar138 = local_1c8 + 1;
      }
      uVar140 = (long)(int)uVar6 & 0xfffffffffffffff8;
      uVar137 = uVar6 >> 2 & 1;
      lVar141 = uVar140 + 1;
      local_2d8 = uVar140 + 2;
      local_2e8._0_8_ = uVar140 + 3;
      local_1b8._0_8_ = uVar140;
      local_158._0_8_ = uVar140;
      uVar140 = 0;
      while (pauVar149 = local_368, uVar140 != uVar137) {
        uVar138 = local_1b8._0_8_ + uVar140 * 4;
        local_198._0_8_ = uVar140;
        if (pvVar8 == (void *)0x0) {
          auVar158 = ZEXT816(0) << 0x40;
        }
        else {
          auVar158 = *(undefined1 (*) [16])((long)pvVar8 + uVar138 * 4);
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar148 = (long)(this->weight_data_tm).w;
        lVar145 = sVar10 * lVar148;
        local_138._0_8_ = uVar138;
        pauVar154 = (undefined1 (*) [16])(lVar145 * uVar138 + (long)pvVar9);
        pauVar146 = (undefined1 (*) [16])((uVar138 | 1) * lVar145 + (long)pvVar9);
        pauVar147 = (undefined1 (*) [16])((uVar138 | 2) * lVar145 + (long)pvVar9);
        pauVar151 = (undefined1 (*) [16])(lVar145 * (uVar138 | 3) + (long)pvVar9);
        lVar150 = 0;
        auVar177 = ZEXT816(0) << 0x40;
        lVar145 = 0;
        auVar159 = ZEXT816(0) << 0x40;
        auVar160 = ZEXT816(0) << 0x40;
        auVar161 = ZEXT816(0) << 0x40;
        iVar152 = 0;
        pauVar139 = local_368;
        while( true ) {
          auVar211 = ZEXT1664(auVar161);
          auVar210 = ZEXT1664(auVar160);
          auVar209 = ZEXT1664(auVar159);
          auVar208 = ZEXT1664(auVar177);
          local_b8 = ZEXT1632(auVar177);
          local_d8 = ZEXT1632(auVar159);
          local_f8 = ZEXT1632(auVar160);
          local_118 = ZEXT1632(auVar161);
          if (iVar144 <= iVar152 + 7) break;
          auVar185 = *pauVar139;
          auVar177 = vlddqu_avx(*pauVar154);
          auVar186 = vcvtph2ps_f16c(auVar177);
          auVar177 = vlddqu_avx(*pauVar146);
          auVar187 = vcvtph2ps_f16c(auVar177);
          auVar177 = vlddqu_avx(*pauVar147);
          auVar188 = vcvtph2ps_f16c(auVar177);
          auVar177 = vlddqu_avx(*pauVar151);
          auVar189 = vcvtph2ps_f16c(auVar177);
          auVar177 = vfmadd231ps_fma(local_b8,auVar185,auVar186);
          auVar159 = vfmadd231ps_fma(local_d8,auVar185,auVar187);
          auVar160 = vfmadd231ps_fma(local_f8,auVar185,auVar188);
          auVar161 = vfmadd231ps_fma(local_118,auVar185,auVar189);
          pauVar139 = pauVar139 + 1;
          pauVar154 = pauVar154 + 1;
          pauVar146 = pauVar146 + 1;
          pauVar147 = pauVar147 + 1;
          pauVar151 = pauVar151 + 1;
          iVar152 = iVar152 + 8;
          lVar145 = lVar145 + 0x10;
          lVar150 = lVar150 + 8;
        }
        lVar155 = sVar10 * local_158._0_8_ * lVar148;
        local_178._0_8_ = lVar141;
        lVar141 = sVar10 * lVar141 * lVar148;
        lVar153 = sVar10 * local_2d8 * lVar148;
        lVar148 = sVar10 * local_2e8._0_8_ * lVar148;
        local_298 = ZEXT816(0) << 0x40;
        local_2a8 = ZEXT816(0) << 0x40;
        local_2b8 = ZEXT816(0) << 0x40;
        local_2c8 = ZEXT816(0) << 0x40;
        for (; iVar152 + 3 < iVar144; iVar152 = iVar152 + 4) {
          auVar159._8_8_ = 0;
          auVar159._0_8_ = *(ulong *)((long)pvVar9 + lVar145 + lVar155);
          auVar159 = vcvtph2ps_f16c(auVar159);
          auVar160._8_8_ = 0;
          auVar160._0_8_ = *(ulong *)((long)pvVar9 + lVar145 + lVar141);
          auVar160 = vcvtph2ps_f16c(auVar160);
          auVar161._8_8_ = 0;
          auVar161._0_8_ = *(ulong *)((long)pvVar9 + lVar145 + lVar153);
          auVar161 = vcvtph2ps_f16c(auVar161);
          auVar162._8_8_ = 0;
          auVar162._0_8_ = *(ulong *)((long)pvVar9 + lVar145 + lVar148);
          auVar162 = vcvtph2ps_f16c(auVar162);
          auVar177 = *(undefined1 (*) [16])(*local_368 + lVar145 * 2);
          local_298 = vfmadd231ps_fma(local_298,auVar177,auVar159);
          local_2a8 = vfmadd231ps_fma(local_2a8,auVar177,auVar160);
          local_2b8 = vfmadd231ps_fma(local_2b8,auVar177,auVar161);
          local_2c8 = vfmadd231ps_fma(local_2c8,auVar177,auVar162);
          lVar145 = lVar145 + 8;
          lVar150 = lVar150 + 4;
        }
        for (; (int)lVar150 < iVar144; lVar150 = lVar150 + 1) {
          local_1f8._0_16_ = auVar158;
          local_218._0_16_ = ZEXT416(*(uint *)(*pauVar149 + lVar150 * 4));
          fVar253 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar150 * 2 + lVar155));
          auVar185 = local_238;
          local_238._4_4_ = extraout_XMM0_Db_05;
          local_238._0_4_ = fVar253;
          local_238._8_4_ = extraout_XMM0_Dc_04;
          local_238._16_16_ = auVar185._16_16_;
          local_238._12_4_ = extraout_XMM0_Dd_04;
          local_248 = ZEXT416(*(uint *)(*pauVar149 + lVar150 * 4));
          local_258 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar150 * 2 + lVar141));
          local_268 = ZEXT416(*(uint *)(*pauVar149 + lVar150 * 4));
          local_278 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar150 * 2 + lVar153));
          local_288 = ZEXT416(*(uint *)(*pauVar149 + lVar150 * 4));
          auVar209._0_4_ =
               float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar150 * 2 + lVar148));
          auVar209._4_60_ = extraout_var_00;
          auVar158 = vinsertps_avx(local_238._0_16_,ZEXT416((uint)local_258),0x10);
          auVar158 = vinsertps_avx(auVar158,ZEXT416((uint)local_278),0x20);
          auVar158 = vinsertps_avx(auVar158,auVar209._0_16_,0x30);
          auVar177 = vinsertps_avx(local_218._0_16_,ZEXT416((uint)local_248._0_4_),0x10);
          auVar177 = vinsertps_avx(auVar177,ZEXT416((uint)local_268._0_4_),0x20);
          auVar177 = vinsertps_avx(auVar177,ZEXT416((uint)local_288._0_4_),0x30);
          auVar158 = vfmadd231ps_fma(local_1f8._0_16_,auVar158,auVar177);
          auVar208 = ZEXT3264(local_b8);
          auVar209 = ZEXT3264(local_d8);
          auVar210 = ZEXT3264(local_f8);
          auVar211 = ZEXT3264(local_118);
        }
        auVar185 = vhaddps_avx(auVar208._0_32_,auVar209._0_32_);
        auVar186 = vhaddps_avx(auVar210._0_32_,auVar211._0_32_);
        auVar185 = vhaddps_avx(auVar185,auVar186);
        auVar159 = vunpcklps_avx(local_298,local_2a8);
        auVar160 = vunpcklps_avx(local_2b8,local_2c8);
        auVar161 = vunpckhps_avx(local_298,local_2a8);
        auVar162 = vunpckhps_avx(local_2b8,local_2c8);
        auVar177 = vmovlhps_avx(auVar159,auVar160);
        auVar160 = vunpckhpd_avx(auVar159,auVar160);
        auVar159 = vmovlhps_avx(auVar161,auVar162);
        auVar161 = vunpckhpd_avx(auVar161,auVar162);
        auVar163._0_4_ =
             auVar160._0_4_ + auVar177._0_4_ + auVar159._0_4_ + auVar161._0_4_ + auVar158._0_4_ +
             auVar185._0_4_ + auVar185._16_4_;
        auVar163._4_4_ =
             auVar160._4_4_ + auVar177._4_4_ + auVar159._4_4_ + auVar161._4_4_ + auVar158._4_4_ +
             auVar185._4_4_ + auVar185._20_4_;
        auVar163._8_4_ =
             auVar160._8_4_ + auVar177._8_4_ + auVar159._8_4_ + auVar161._8_4_ + auVar158._8_4_ +
             auVar185._8_4_ + auVar185._24_4_;
        auVar163._12_4_ =
             auVar160._12_4_ + auVar177._12_4_ + auVar159._12_4_ + auVar161._12_4_ + auVar158._12_4_
             + auVar185._12_4_ + auVar185._28_4_;
        auVar158 = auVar163;
        if (iVar136 - 1U < 6) {
          auVar177 = ZEXT816(0) << 0x20;
          auVar158 = vmaxps_avx(auVar163,auVar177);
          switch(iVar136) {
          case 2:
            auVar177 = vminps_avx(auVar163,auVar177);
            uVar2 = *(this->super_InnerProduct).activation_params.data;
            auVar59._4_4_ = uVar2;
            auVar59._0_4_ = uVar2;
            auVar59._8_4_ = uVar2;
            auVar59._12_4_ = uVar2;
            auVar158 = vfmadd231ps_avx512vl(auVar158,auVar177,auVar59);
            break;
          case 3:
            puVar11 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar11;
            auVar57._4_4_ = uVar2;
            auVar57._0_4_ = uVar2;
            auVar57._8_4_ = uVar2;
            auVar57._12_4_ = uVar2;
            auVar158 = vmaxps_avx512vl(auVar163,auVar57);
            uVar2 = puVar11[1];
            auVar58._4_4_ = uVar2;
            auVar58._0_4_ = uVar2;
            auVar58._8_4_ = uVar2;
            auVar58._12_4_ = uVar2;
            auVar158 = vminps_avx512vl(auVar158,auVar58);
            break;
          case 4:
            auVar46._8_4_ = 0x80000000;
            auVar46._0_8_ = 0x8000000080000000;
            auVar46._12_4_ = 0x80000000;
            auVar158 = vxorps_avx512vl(auVar163,auVar46);
            auVar47._8_4_ = 0x42b0c0a5;
            auVar47._0_8_ = 0x42b0c0a542b0c0a5;
            auVar47._12_4_ = 0x42b0c0a5;
            auVar158 = vminps_avx512vl(auVar158,auVar47);
            auVar48._8_4_ = 0xc2b0c0a5;
            auVar48._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar48._12_4_ = 0xc2b0c0a5;
            auVar177 = vmaxps_avx512vl(auVar158,auVar48);
            auVar285._8_4_ = 0x3f000000;
            auVar285._0_8_ = 0x3f0000003f000000;
            auVar285._12_4_ = 0x3f000000;
            auVar49._8_4_ = 0x3fb8aa3b;
            auVar49._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar49._12_4_ = 0x3fb8aa3b;
            auVar159 = vfmadd231ps_avx512vl(auVar285,auVar177,auVar49);
            auVar263._0_4_ = (int)auVar159._0_4_;
            auVar263._4_4_ = (int)auVar159._4_4_;
            auVar263._8_4_ = (int)auVar159._8_4_;
            auVar263._12_4_ = (int)auVar159._12_4_;
            auVar158 = vcvtdq2ps_avx(auVar263);
            uVar140 = vcmpps_avx512vl(auVar159,auVar158,1);
            auVar290._8_4_ = 0x3f800000;
            auVar290._0_8_ = 0x3f8000003f800000;
            auVar290._12_4_ = 0x3f800000;
            auVar159 = vsubps_avx512vl(auVar158,auVar290);
            bVar14 = (bool)((byte)uVar140 & 1);
            auVar183._0_4_ = (float)((uint)bVar14 * auVar159._0_4_ | (uint)!bVar14 * auVar158._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar140 >> 1) & 1);
            auVar183._4_4_ = (float)((uint)bVar14 * auVar159._4_4_ | (uint)!bVar14 * auVar158._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar140 >> 2) & 1);
            auVar183._8_4_ = (float)((uint)bVar14 * auVar159._8_4_ | (uint)!bVar14 * auVar158._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar140 >> 3) & 1);
            auVar183._12_4_ =
                 (float)((uint)bVar14 * auVar159._12_4_ | (uint)!bVar14 * auVar158._12_4_);
            auVar50._8_4_ = 0x3f318000;
            auVar50._0_8_ = 0x3f3180003f318000;
            auVar50._12_4_ = 0x3f318000;
            auVar158 = vfmsub231ps_avx512vl(auVar177,auVar183,auVar50);
            auVar51._8_4_ = 0x395e8083;
            auVar51._0_8_ = 0x395e8083395e8083;
            auVar51._12_4_ = 0x395e8083;
            auVar177 = vfmsub231ps_avx512vl(auVar158,auVar183,auVar51);
            auVar242._0_4_ = auVar177._0_4_ * auVar177._0_4_;
            auVar242._4_4_ = auVar177._4_4_ * auVar177._4_4_;
            auVar242._8_4_ = auVar177._8_4_ * auVar177._8_4_;
            auVar242._12_4_ = auVar177._12_4_ * auVar177._12_4_;
            auVar276._8_4_ = 0x39506967;
            auVar276._0_8_ = 0x3950696739506967;
            auVar276._12_4_ = 0x39506967;
            auVar52._8_4_ = 0x3ab743ce;
            auVar52._0_8_ = 0x3ab743ce3ab743ce;
            auVar52._12_4_ = 0x3ab743ce;
            auVar158 = vfmadd213ps_avx512vl(auVar276,auVar177,auVar52);
            auVar53._8_4_ = 0x3c088908;
            auVar53._0_8_ = 0x3c0889083c088908;
            auVar53._12_4_ = 0x3c088908;
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar177,auVar53);
            auVar54._8_4_ = 0x3d2aa9c1;
            auVar54._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar54._12_4_ = 0x3d2aa9c1;
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar177,auVar54);
            auVar55._8_4_ = 0x3e2aaaaa;
            auVar55._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar55._12_4_ = 0x3e2aaaaa;
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar177,auVar55);
            auVar158 = vfmadd213ps_fma(auVar158,auVar177,auVar285);
            auVar158 = vfmadd213ps_fma(auVar158,auVar242,auVar177);
            auVar227._0_4_ = auVar158._0_4_ + 1.0;
            auVar227._4_4_ = auVar158._4_4_ + 1.0;
            auVar227._8_4_ = auVar158._8_4_ + 1.0;
            auVar227._12_4_ = auVar158._12_4_ + 1.0;
            auVar243._0_4_ = (int)auVar183._0_4_;
            auVar243._4_4_ = (int)auVar183._4_4_;
            auVar243._8_4_ = (int)auVar183._8_4_;
            auVar243._12_4_ = (int)auVar183._12_4_;
            auVar158 = vpslld_avx(auVar243,0x17);
            auVar56._8_4_ = 0x3f800000;
            auVar56._0_8_ = 0x3f8000003f800000;
            auVar56._12_4_ = 0x3f800000;
            auVar158 = vpaddd_avx512vl(auVar158,auVar56);
            auVar158 = vfmadd213ps_fma(auVar158,auVar227,auVar290);
            auVar158 = vdivps_avx(auVar290,auVar158);
            break;
          case 5:
            auVar295._8_4_ = 0x42b0c0a5;
            auVar295._0_8_ = 0x42b0c0a542b0c0a5;
            auVar295._12_4_ = 0x42b0c0a5;
            auVar158 = vminps_avx(auVar163,auVar295);
            auVar300._8_4_ = 0xc2b0c0a5;
            auVar300._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar300._12_4_ = 0xc2b0c0a5;
            auVar159 = vmaxps_avx(auVar158,auVar300);
            auVar308._8_4_ = 0x3fb8aa3b;
            auVar308._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar308._12_4_ = 0x3fb8aa3b;
            auVar304._8_4_ = 0x3f000000;
            auVar304._0_8_ = 0x3f0000003f000000;
            auVar304._12_4_ = 0x3f000000;
            auVar160 = vfmadd213ps_fma(auVar308,auVar159,auVar304);
            auVar273._0_4_ = (int)auVar160._0_4_;
            auVar273._4_4_ = (int)auVar160._4_4_;
            auVar273._8_4_ = (int)auVar160._8_4_;
            auVar273._12_4_ = (int)auVar160._12_4_;
            auVar158 = vcvtdq2ps_avx(auVar273);
            uVar140 = vcmpps_avx512vl(auVar160,auVar158,1);
            auVar312._8_4_ = 0x3f800000;
            auVar312._0_8_ = 0x3f8000003f800000;
            auVar312._12_4_ = 0x3f800000;
            auVar160 = vsubps_avx512vl(auVar158,auVar312);
            bVar14 = (bool)((byte)uVar140 & 1);
            auVar178._0_4_ = (float)((uint)bVar14 * auVar160._0_4_ | (uint)!bVar14 * auVar158._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar140 >> 1) & 1);
            auVar178._4_4_ = (float)((uint)bVar14 * auVar160._4_4_ | (uint)!bVar14 * auVar158._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar140 >> 2) & 1);
            auVar178._8_4_ = (float)((uint)bVar14 * auVar160._8_4_ | (uint)!bVar14 * auVar158._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar140 >> 3) & 1);
            auVar178._12_4_ =
                 (float)((uint)bVar14 * auVar160._12_4_ | (uint)!bVar14 * auVar158._12_4_);
            auVar316._8_4_ = 0x3f318000;
            auVar316._0_8_ = 0x3f3180003f318000;
            auVar316._12_4_ = 0x3f318000;
            auVar158 = vfmsub231ps_fma(auVar159,auVar178,auVar316);
            auVar160 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar159 = vfnmsub231ps_avx512vl(auVar158,auVar178,auVar160);
            auVar259._0_4_ = auVar159._0_4_ * auVar159._0_4_;
            auVar259._4_4_ = auVar159._4_4_ * auVar159._4_4_;
            auVar259._8_4_ = auVar159._8_4_ * auVar159._8_4_;
            auVar259._12_4_ = auVar159._12_4_ * auVar159._12_4_;
            auVar320._8_4_ = 0x39506967;
            auVar320._0_8_ = 0x3950696739506967;
            auVar320._12_4_ = 0x39506967;
            auVar324._8_4_ = 0x3ab743ce;
            auVar324._0_8_ = 0x3ab743ce3ab743ce;
            auVar324._12_4_ = 0x3ab743ce;
            auVar158 = vfmadd213ps_fma(auVar320,auVar159,auVar324);
            auVar328._8_4_ = 0x3c088908;
            auVar328._0_8_ = 0x3c0889083c088908;
            auVar328._12_4_ = 0x3c088908;
            auVar158 = vfmadd213ps_fma(auVar158,auVar159,auVar328);
            auVar331._8_4_ = 0x3d2aa9c1;
            auVar331._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar331._12_4_ = 0x3d2aa9c1;
            auVar158 = vfmadd213ps_fma(auVar158,auVar159,auVar331);
            auVar161 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar159,auVar161);
            auVar158 = vfmadd213ps_fma(auVar158,auVar159,auVar304);
            auVar158 = vfmadd213ps_fma(auVar158,auVar259,auVar159);
            auVar238._0_4_ = auVar158._0_4_ + 1.0;
            auVar238._4_4_ = auVar158._4_4_ + 1.0;
            auVar238._8_4_ = auVar158._8_4_ + 1.0;
            auVar238._12_4_ = auVar158._12_4_ + 1.0;
            auVar260._0_4_ = (int)auVar178._0_4_;
            auVar260._4_4_ = (int)auVar178._4_4_;
            auVar260._8_4_ = (int)auVar178._8_4_;
            auVar260._12_4_ = (int)auVar178._12_4_;
            auVar158 = vpslld_avx(auVar260,0x17);
            auVar162 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar158 = vpaddd_avx512vl(auVar158,auVar162);
            auVar158 = vfmadd213ps_fma(auVar158,auVar238,auVar312);
            uVar140 = vcmpps_avx512vl(auVar158,auVar177,2);
            auVar166._8_4_ = 0x800000;
            auVar166._0_8_ = 0x80000000800000;
            auVar166._12_4_ = 0x800000;
            auVar158 = vmaxps_avx512vl(auVar158,auVar166);
            auVar159 = vpsrld_avx(auVar158,0x17);
            auVar274._8_4_ = 0x807fffff;
            auVar274._0_8_ = 0x807fffff807fffff;
            auVar274._12_4_ = 0x807fffff;
            auVar167._8_4_ = 0x3f000000;
            auVar167._0_8_ = 0x3f0000003f000000;
            auVar167._12_4_ = 0x3f000000;
            auVar158 = vpternlogd_avx512vl(auVar158,auVar274,auVar167,0xea);
            auVar168._8_4_ = 0x3f3504f3;
            auVar168._0_8_ = 0x3f3504f33f3504f3;
            auVar168._12_4_ = 0x3f3504f3;
            uVar138 = vcmpps_avx512vl(auVar158,auVar168,1);
            auVar36._8_4_ = 0xbf800000;
            auVar36._0_8_ = 0xbf800000bf800000;
            auVar36._12_4_ = 0xbf800000;
            auVar177 = vaddps_avx512vl(auVar158,auVar36);
            auVar158 = vaddps_avx512vl(auVar177,auVar158);
            bVar14 = (bool)((byte)uVar138 & 1);
            auVar179._0_4_ = (float)((uint)bVar14 * auVar158._0_4_ | (uint)!bVar14 * auVar177._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar138 >> 1) & 1);
            auVar179._4_4_ = (float)((uint)bVar14 * auVar158._4_4_ | (uint)!bVar14 * auVar177._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar138 >> 2) & 1);
            auVar179._8_4_ = (float)((uint)bVar14 * auVar158._8_4_ | (uint)!bVar14 * auVar177._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar138 >> 3) & 1);
            auVar179._12_4_ =
                 (float)((uint)bVar14 * auVar158._12_4_ | (uint)!bVar14 * auVar177._12_4_);
            auVar239._0_4_ = auVar179._0_4_ * auVar179._0_4_;
            auVar239._4_4_ = auVar179._4_4_ * auVar179._4_4_;
            auVar239._8_4_ = auVar179._8_4_ * auVar179._8_4_;
            auVar239._12_4_ = auVar179._12_4_ * auVar179._12_4_;
            auVar283._8_4_ = 0x3d9021bb;
            auVar283._0_8_ = 0x3d9021bb3d9021bb;
            auVar283._12_4_ = 0x3d9021bb;
            auVar37._8_4_ = 0xbdebd1b8;
            auVar37._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar37._12_4_ = 0xbdebd1b8;
            auVar158 = vfmadd213ps_avx512vl(auVar283,auVar179,auVar37);
            auVar38._8_4_ = 0x3def251a;
            auVar38._0_8_ = 0x3def251a3def251a;
            auVar38._12_4_ = 0x3def251a;
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar179,auVar38);
            auVar39._8_4_ = 0xbdfe5d4f;
            auVar39._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar39._12_4_ = 0xbdfe5d4f;
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar179,auVar39);
            auVar40._8_4_ = 0x3e11e9bf;
            auVar40._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar40._12_4_ = 0x3e11e9bf;
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar179,auVar40);
            auVar41._8_4_ = 0xbe2aae50;
            auVar41._0_8_ = 0xbe2aae50be2aae50;
            auVar41._12_4_ = 0xbe2aae50;
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar179,auVar41);
            auVar42._8_4_ = 0x3e4cceac;
            auVar42._0_8_ = 0x3e4cceac3e4cceac;
            auVar42._12_4_ = 0x3e4cceac;
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar179,auVar42);
            auVar43._8_4_ = 0xbe7ffffc;
            auVar43._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar43._12_4_ = 0xbe7ffffc;
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar179,auVar43);
            auVar44._8_4_ = 0x3eaaaaaa;
            auVar44._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar44._12_4_ = 0x3eaaaaaa;
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar179,auVar44);
            auVar284._0_4_ = auVar239._0_4_ * auVar179._0_4_ * auVar158._0_4_;
            auVar284._4_4_ = auVar239._4_4_ * auVar179._4_4_ * auVar158._4_4_;
            auVar284._8_4_ = auVar239._8_4_ * auVar179._8_4_ * auVar158._8_4_;
            auVar284._12_4_ = auVar239._12_4_ * auVar179._12_4_ * auVar158._12_4_;
            auVar45._8_4_ = 0xffffff82;
            auVar45._0_8_ = 0xffffff82ffffff82;
            auVar45._12_4_ = 0xffffff82;
            auVar158 = vpaddd_avx512vl(auVar159,auVar45);
            auVar158 = vcvtdq2ps_avx(auVar158);
            auVar177 = vsubps_avx512vl(auVar158,auVar312);
            bVar14 = (bool)((byte)uVar138 & 1);
            auVar180._0_4_ = (uint)bVar14 * auVar177._0_4_ | (uint)!bVar14 * auVar158._0_4_;
            bVar14 = (bool)((byte)(uVar138 >> 1) & 1);
            auVar180._4_4_ = (uint)bVar14 * auVar177._4_4_ | (uint)!bVar14 * auVar158._4_4_;
            bVar14 = (bool)((byte)(uVar138 >> 2) & 1);
            auVar180._8_4_ = (uint)bVar14 * auVar177._8_4_ | (uint)!bVar14 * auVar158._8_4_;
            bVar14 = (bool)((byte)(uVar138 >> 3) & 1);
            auVar180._12_4_ = (uint)bVar14 * auVar177._12_4_ | (uint)!bVar14 * auVar158._12_4_;
            auVar158 = vfmadd231ps_avx512vl(auVar284,auVar180,auVar160);
            auVar158 = vfmsub231ps_fma(auVar158,auVar304,auVar239);
            auVar158 = vsubps_avx(auVar158,auVar179);
            auVar158 = vfnmadd231ps_fma(auVar158,auVar316,auVar180);
            auVar177 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar14 = (bool)((byte)uVar140 & 1);
            auVar181._0_4_ =
                 (uint)bVar14 * auVar177._0_4_ |
                 (uint)!bVar14 * (int)(auVar158._0_4_ + auVar158._0_4_);
            bVar14 = (bool)((byte)(uVar140 >> 1) & 1);
            auVar181._4_4_ =
                 (uint)bVar14 * auVar177._4_4_ |
                 (uint)!bVar14 * (int)(auVar158._4_4_ + auVar158._4_4_);
            bVar14 = (bool)((byte)(uVar140 >> 2) & 1);
            auVar181._8_4_ =
                 (uint)bVar14 * auVar177._8_4_ |
                 (uint)!bVar14 * (int)(auVar158._8_4_ + auVar158._8_4_);
            bVar14 = (bool)((byte)(uVar140 >> 3) & 1);
            auVar181._12_4_ =
                 (uint)bVar14 * auVar177._12_4_ |
                 (uint)!bVar14 * (int)(auVar158._12_4_ + auVar158._12_4_);
            auVar158 = vminps_avx(auVar181,auVar295);
            auVar177 = vmaxps_avx(auVar158,auVar300);
            auVar159 = vfmadd213ps_fma(auVar308,auVar177,auVar304);
            auVar275._0_4_ = (int)auVar159._0_4_;
            auVar275._4_4_ = (int)auVar159._4_4_;
            auVar275._8_4_ = (int)auVar159._8_4_;
            auVar275._12_4_ = (int)auVar159._12_4_;
            auVar158 = vcvtdq2ps_avx(auVar275);
            uVar140 = vcmpps_avx512vl(auVar159,auVar158,1);
            auVar159 = vsubps_avx512vl(auVar158,auVar312);
            bVar14 = (bool)((byte)uVar140 & 1);
            auVar182._0_4_ = (float)((uint)bVar14 * auVar159._0_4_ | (uint)!bVar14 * auVar158._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar140 >> 1) & 1);
            auVar182._4_4_ = (float)((uint)bVar14 * auVar159._4_4_ | (uint)!bVar14 * auVar158._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar140 >> 2) & 1);
            auVar182._8_4_ = (float)((uint)bVar14 * auVar159._8_4_ | (uint)!bVar14 * auVar158._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar140 >> 3) & 1);
            auVar182._12_4_ =
                 (float)((uint)bVar14 * auVar159._12_4_ | (uint)!bVar14 * auVar158._12_4_);
            auVar158 = vfmsub231ps_fma(auVar177,auVar182,auVar316);
            auVar177 = vfnmsub231ps_avx512vl(auVar158,auVar182,auVar160);
            auVar261._0_4_ = auVar177._0_4_ * auVar177._0_4_;
            auVar261._4_4_ = auVar177._4_4_ * auVar177._4_4_;
            auVar261._8_4_ = auVar177._8_4_ * auVar177._8_4_;
            auVar261._12_4_ = auVar177._12_4_ * auVar177._12_4_;
            auVar158 = vfmadd213ps_fma(auVar320,auVar177,auVar324);
            auVar158 = vfmadd213ps_fma(auVar158,auVar177,auVar328);
            auVar158 = vfmadd213ps_fma(auVar158,auVar177,auVar331);
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar177,auVar161);
            auVar158 = vfmadd213ps_fma(auVar158,auVar177,auVar304);
            auVar158 = vfmadd213ps_fma(auVar158,auVar261,auVar177);
            auVar240._0_4_ = auVar158._0_4_ + 1.0;
            auVar240._4_4_ = auVar158._4_4_ + 1.0;
            auVar240._8_4_ = auVar158._8_4_ + 1.0;
            auVar240._12_4_ = auVar158._12_4_ + 1.0;
            auVar262._0_4_ = (int)auVar182._0_4_;
            auVar262._4_4_ = (int)auVar182._4_4_;
            auVar262._8_4_ = (int)auVar182._8_4_;
            auVar262._12_4_ = (int)auVar182._12_4_;
            auVar158 = vpslld_avx(auVar262,0x17);
            auVar158 = vpaddd_avx512vl(auVar158,auVar162);
            auVar158 = vfmadd213ps_fma(auVar158,auVar240,auVar312);
            auVar241._8_4_ = 0x40000000;
            auVar241._0_8_ = 0x4000000040000000;
            auVar241._12_4_ = 0x40000000;
            auVar158 = vdivps_avx(auVar241,auVar158);
            auVar158 = vfmsub213ps_fma(auVar158,auVar163,auVar163);
            break;
          case 6:
            puVar11 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar11;
            auVar165._4_4_ = uVar2;
            auVar165._0_4_ = uVar2;
            auVar165._8_4_ = uVar2;
            auVar165._12_4_ = uVar2;
            uVar2 = puVar11[1];
            auVar164._4_4_ = uVar2;
            auVar164._0_4_ = uVar2;
            auVar164._8_4_ = uVar2;
            auVar164._12_4_ = uVar2;
            auVar158 = vfmadd213ps_avx512vl(auVar165,auVar163,auVar164);
            auVar158 = vmaxps_avx(auVar158,auVar177);
            auVar169._8_4_ = 0x3f800000;
            auVar169._0_8_ = 0x3f8000003f800000;
            auVar169._12_4_ = 0x3f800000;
            auVar177 = vminps_avx512vl(auVar158,auVar169);
            auVar158._0_4_ = auVar177._0_4_ * auVar163._0_4_;
            auVar158._4_4_ = auVar177._4_4_ * auVar163._4_4_;
            auVar158._8_4_ = auVar177._8_4_ * auVar163._8_4_;
            auVar158._12_4_ = auVar177._12_4_ * auVar163._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + local_138._0_8_ * 4) = auVar158;
        local_158._0_8_ = local_158._0_8_ + 4;
        lVar141 = local_178._0_8_ + 4;
        local_2d8 = local_2d8 + 4;
        local_2e8._0_8_ = local_2e8._0_8_ + 4;
        uVar140 = local_198._0_8_ + 1;
      }
      for (lVar141 = (long)(int)(local_1b8._0_4_ + uVar137 * 4); pauVar149 = local_368,
          lVar141 < (int)uVar6; lVar141 = lVar141 + 1) {
        if (pvVar8 == (void *)0x0) {
          auVar208 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        else {
          auVar208 = ZEXT464(*(uint *)((long)pvVar8 + lVar141 * 4));
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar145 = (long)(this->weight_data_tm).w;
        pauVar146 = (undefined1 (*) [16])(lVar141 * lVar145 * sVar10 + (long)pvVar9);
        lVar148 = 0;
        auVar158 = ZEXT816(0) << 0x40;
        iVar152 = 0;
        pauVar139 = local_368;
        while( true ) {
          auVar209 = ZEXT1664(auVar158);
          local_218 = ZEXT1632(auVar158);
          if (iVar144 <= iVar152 + 7) break;
          auVar158 = vlddqu_avx(*pauVar146);
          auVar185 = vcvtph2ps_f16c(auVar158);
          auVar158 = vfmadd231ps_fma(local_218,auVar185,*pauVar139);
          pauVar139 = pauVar139 + 1;
          pauVar146 = pauVar146 + 1;
          iVar152 = iVar152 + 8;
          lVar148 = lVar148 + 8;
        }
        auVar158 = ZEXT816(0) << 0x40;
        for (; iVar152 + 3 < iVar144; iVar152 = iVar152 + 4) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)*pauVar146;
          auVar177 = vcvtph2ps_f16c(auVar5);
          auVar158 = vfmadd231ps_fma(auVar158,auVar177,*(undefined1 (*) [16])*pauVar139);
          pauVar139 = (undefined1 (*) [32])(*pauVar139 + 0x10);
          pauVar146 = (undefined1 (*) [16])(*pauVar146 + 8);
          lVar148 = lVar148 + 4;
        }
        local_238._0_16_ = auVar158;
        for (; (int)lVar148 < iVar144; lVar148 = lVar148 + 1) {
          local_1f8._0_4_ = *(undefined4 *)(*pauVar149 + lVar148 * 4);
          auVar210._0_4_ =
               float16_to_float32(*(unsigned_short *)
                                   ((long)pvVar9 + lVar148 * 2 + sVar10 * lVar141 * lVar145));
          auVar210._4_60_ = extraout_var_01;
          auVar158 = vfmadd231ss_fma(ZEXT416((uint)auVar208._0_4_),auVar210._0_16_,
                                     ZEXT416((uint)local_1f8._0_4_));
          auVar208 = ZEXT1664(auVar158);
          auVar209 = ZEXT3264(local_218);
          auVar158 = local_238._0_16_;
        }
        auVar228._0_4_ = auVar209._0_4_ + auVar158._0_4_ + auVar209._16_4_;
        auVar228._4_4_ = auVar209._4_4_ + auVar158._4_4_ + auVar209._20_4_;
        auVar228._8_4_ = auVar209._8_4_ + auVar158._8_4_ + auVar209._24_4_;
        auVar228._12_4_ = auVar209._12_4_ + auVar158._12_4_ + auVar209._28_4_;
        auVar158 = vhaddps_avx(auVar228,auVar228);
        auVar158 = vhaddps_avx(auVar158,auVar158);
        fVar253 = auVar158._0_4_ + auVar208._0_4_;
        auVar158 = ZEXT416((uint)fVar253);
        fVar224 = fVar253;
        switch(iVar136) {
        case 1:
          auVar158 = vmaxss_avx(auVar158,ZEXT416(0));
          fVar224 = auVar158._0_4_;
          break;
        case 2:
          uVar18 = vcmpss_avx512f(auVar158,ZEXT416(0),0xe);
          bVar14 = (bool)((byte)uVar18 & 1);
          fVar224 = (float)((uint)bVar14 * 0x3f800000 +
                           (uint)!bVar14 * *(this->super_InnerProduct).activation_params.data) *
                    fVar253;
          break;
        case 3:
          puVar12 = (uint *)(this->super_InnerProduct).activation_params.data;
          fVar253 = (float)puVar12[1];
          auVar158 = vmaxss_avx(auVar158,ZEXT416(*puVar12));
          fVar224 = auVar158._0_4_;
          if (fVar253 < auVar158._0_4_) {
            fVar224 = fVar253;
          }
          break;
        case 4:
          auVar158 = vminss_avx(auVar158,SUB6416(ZEXT464(0x42b0c0a5),0));
          auVar61._8_4_ = 0x80000000;
          auVar61._0_8_ = 0x8000000080000000;
          auVar61._12_4_ = 0x80000000;
          auVar177 = vxorps_avx512vl(auVar158,auVar61);
          uVar18 = vcmpss_avx512f(auVar158,ZEXT416(0xc2b0c0a5),1);
          bVar14 = (bool)((byte)uVar18 & 1);
          fVar253 = expf((float)((uint)bVar14 * 0x42b0c0a5 + (uint)!bVar14 * auVar177._0_4_));
          fVar224 = 1.0 / (fVar253 + 1.0);
          break;
        case 5:
          fVar224 = expf(fVar253);
          fVar224 = logf(fVar224 + 1.0);
          fVar224 = tanhf(fVar224);
          fVar224 = fVar224 * fVar253;
          break;
        case 6:
          pfVar13 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar3 = *pfVar13;
          auVar60._8_4_ = 0x80000000;
          auVar60._0_8_ = 0x8000000080000000;
          auVar60._12_4_ = 0x80000000;
          auVar159 = ZEXT416((uint)pfVar13[1]);
          auVar177 = vxorps_avx512vl(auVar159,auVar60);
          fVar271 = auVar177._0_4_ / fVar3;
          fVar224 = 0.0;
          if ((fVar271 <= fVar253) && (fVar224 = fVar253, fVar253 <= fVar271 + 1.0 / fVar3)) {
            auVar158 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar158,auVar159);
            fVar224 = auVar158._0_4_ * fVar253;
          }
        }
        *(float *)((long)top_blob->data + lVar141 * 4) = fVar224;
      }
    }
    else if (iVar152 == 4) {
      uVar138 = 0;
      if (0 < (int)uVar6) {
        uVar138 = uVar140;
      }
      auVar177 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar159 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar272._8_4_ = 0x3f000000;
      auVar272._0_8_ = 0x3f0000003f000000;
      auVar272._12_4_ = 0x3f000000;
      auVar160 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar289._8_4_ = 0x3f800000;
      auVar289._0_8_ = 0x3f8000003f800000;
      auVar289._12_4_ = 0x3f800000;
      auVar294._8_4_ = 0x3f318000;
      auVar294._0_8_ = 0x3f3180003f318000;
      auVar294._12_4_ = 0x3f318000;
      auVar303._8_4_ = 0x39506967;
      auVar303._0_8_ = 0x3950696739506967;
      auVar303._12_4_ = 0x39506967;
      auVar307._8_4_ = 0x3ab743ce;
      auVar307._0_8_ = 0x3ab743ce3ab743ce;
      auVar307._12_4_ = 0x3ab743ce;
      auVar311._8_4_ = 0x3c088908;
      auVar311._0_8_ = 0x3c0889083c088908;
      auVar311._12_4_ = 0x3c088908;
      auVar315._8_4_ = 0x3d2aa9c1;
      auVar315._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar315._12_4_ = 0x3d2aa9c1;
      auVar319._8_4_ = 0x3e2aaaaa;
      auVar319._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar319._12_4_ = 0x3e2aaaaa;
      auVar323._8_4_ = 0x3f800000;
      auVar323._0_8_ = 0x3f8000003f800000;
      auVar323._12_4_ = 0x3f800000;
      auVar327._8_4_ = 0xb95e8083;
      auVar327._0_8_ = 0xb95e8083b95e8083;
      auVar327._12_4_ = 0xb95e8083;
      auVar161 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar162 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar163 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar158 = vxorps_avx512vl(auVar158,auVar158);
      auVar164 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (uVar140 = 0; uVar140 != uVar138; uVar140 = uVar140 + 1) {
        if (pvVar8 == (void *)0x0) {
          auVar169 = ZEXT816(0) << 0x40;
        }
        else {
          auVar169 = *(undefined1 (*) [16])((long)pvVar8 + uVar140 * 0x10);
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar145 = (long)(this->weight_data_tm).w;
        pauVar139 = (undefined1 (*) [32])(uVar140 * lVar145 * sVar10 + (long)pvVar9);
        lVar141 = 0;
        auVar208 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar209 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar165 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar165);
        auVar165 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar165);
        pauVar149 = local_368;
        for (iVar152 = 0; iVar152 + 7 < iVar144; iVar152 = iVar152 + 8) {
          auVar165 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar149));
          auVar166 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar149 + 4)));
          auVar167 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar149 + 8)));
          auVar168 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar149 + 0xc)));
          auVar187 = vinsertf32x4_avx512vl(ZEXT1632(auVar165),auVar166,1);
          auVar188 = vinsertf32x4_avx512vl(ZEXT1632(auVar167),auVar168,1);
          auVar165 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar149 + 0x10)));
          auVar166 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar149 + 0x14)));
          auVar167 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar149 + 0x18)));
          auVar189 = vinsertf32x4_avx512vl(ZEXT1632(auVar165),auVar166,1);
          auVar165 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar149 + 0x1c)));
          auVar190 = vinsertf32x4_avx512vl(ZEXT1632(auVar167),auVar165,1);
          auVar185 = vlddqu_avx(*pauVar139);
          auVar186 = vlddqu_avx(pauVar139[1]);
          auVar191 = vcvtph2ps_avx512vl(auVar185._0_16_);
          auVar185 = vcvtph2ps_f16c(auVar185._16_16_);
          auVar192 = vcvtph2ps_avx512vl(auVar186._0_16_);
          auVar186 = vcvtph2ps_f16c(auVar186._16_16_);
          auVar187 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar187,auVar191);
          in_ZMM17 = ZEXT3264(auVar187);
          auVar185 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar188,auVar185);
          in_ZMM16 = ZEXT3264(auVar185);
          auVar185 = vfmadd231ps_avx512vl(auVar209._0_32_,auVar189,auVar192);
          auVar209 = ZEXT3264(auVar185);
          auVar185 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar190,auVar186);
          auVar208 = ZEXT3264(auVar185);
          pauVar149 = pauVar149 + 1;
          pauVar139 = pauVar139 + 2;
          lVar141 = lVar141 + 8;
        }
        while( true ) {
          if (iVar144 <= iVar152 + 3) break;
          uVar2 = *(undefined4 *)*pauVar149;
          auVar244._4_4_ = uVar2;
          auVar244._0_4_ = uVar2;
          auVar244._8_4_ = uVar2;
          auVar244._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar149 + 4);
          auVar244._20_4_ = uVar2;
          auVar244._16_4_ = uVar2;
          auVar244._24_4_ = uVar2;
          auVar244._28_4_ = uVar2;
          auVar165 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar149 + 8)));
          auVar166 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar149 + 0xc)));
          auVar186 = vinsertf32x4_avx512vl(ZEXT1632(auVar165),auVar166,1);
          auVar185 = vlddqu_avx(*pauVar139);
          auVar187 = vcvtph2ps_avx512vl(auVar185._0_16_);
          auVar185 = vcvtph2ps_f16c(auVar185._16_16_);
          auVar187 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar244,auVar187);
          in_ZMM17 = ZEXT3264(auVar187);
          auVar185 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar186,auVar185);
          in_ZMM16 = ZEXT3264(auVar185);
          pauVar149 = (undefined1 (*) [32])(*pauVar149 + 0x10);
          pauVar139 = pauVar139 + 1;
          iVar152 = iVar152 + 4;
          lVar141 = lVar141 + 4;
        }
        for (; (int)lVar141 < iVar144; lVar141 = lVar141 + 1) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)((long)pvVar9 + lVar141 * 8 + sVar10 * uVar140 * lVar145);
          auVar165 = vcvtph2ps_f16c(auVar4);
          uVar2 = *(undefined4 *)(*local_368 + lVar141 * 4);
          auVar19._4_4_ = uVar2;
          auVar19._0_4_ = uVar2;
          auVar19._8_4_ = uVar2;
          auVar19._12_4_ = uVar2;
          auVar169 = vfmadd231ps_avx512vl(auVar169,auVar165,auVar19);
        }
        auVar185 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM17._0_32_);
        fVar253 = auVar209._4_4_ + auVar208._4_4_ + auVar185._4_4_;
        auVar225._0_4_ =
             auVar209._16_4_ + auVar208._16_4_ + auVar185._16_4_ +
             auVar209._0_4_ + auVar208._0_4_ + auVar185._0_4_ + auVar169._0_4_;
        auVar225._4_4_ = fVar253 + fVar253 + auVar169._4_4_;
        auVar225._8_4_ =
             auVar209._24_4_ + auVar208._24_4_ + auVar185._24_4_ +
             auVar209._8_4_ + auVar208._8_4_ + auVar185._8_4_ + auVar169._8_4_;
        auVar225._12_4_ =
             auVar209._28_4_ + auVar208._28_4_ + auVar185._28_4_ +
             auVar209._12_4_ + auVar208._12_4_ + auVar185._12_4_ + auVar169._12_4_;
        auVar170 = auVar225;
        if (iVar136 - 1U < 6) {
          auVar170 = vmaxps_avx512vl(auVar225,auVar158);
          switch(iVar136) {
          case 2:
            auVar169 = vminps_avx512vl(auVar225,auVar158);
            uVar2 = *(this->super_InnerProduct).activation_params.data;
            auVar35._4_4_ = uVar2;
            auVar35._0_4_ = uVar2;
            auVar35._8_4_ = uVar2;
            auVar35._12_4_ = uVar2;
            auVar170 = vfmadd231ps_avx512vl(auVar170,auVar169,auVar35);
            break;
          case 3:
            puVar11 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar11;
            auVar33._4_4_ = uVar2;
            auVar33._0_4_ = uVar2;
            auVar33._8_4_ = uVar2;
            auVar33._12_4_ = uVar2;
            auVar169 = vmaxps_avx512vl(auVar225,auVar33);
            uVar2 = puVar11[1];
            auVar34._4_4_ = uVar2;
            auVar34._0_4_ = uVar2;
            auVar34._8_4_ = uVar2;
            auVar34._12_4_ = uVar2;
            auVar170 = vminps_avx512vl(auVar169,auVar34);
            break;
          case 4:
            auVar31._8_4_ = 0x80000000;
            auVar31._0_8_ = 0x8000000080000000;
            auVar31._12_4_ = 0x80000000;
            auVar169 = vxorps_avx512vl(auVar225,auVar31);
            auVar169 = vminps_avx512vl(auVar169,auVar177);
            auVar165 = vmaxps_avx512vl(auVar169,auVar159);
            auVar166 = vfmadd231ps_avx512vl(auVar272,auVar165,auVar160);
            auVar258._0_4_ = (int)auVar166._0_4_;
            auVar258._4_4_ = (int)auVar166._4_4_;
            auVar258._8_4_ = (int)auVar166._8_4_;
            auVar258._12_4_ = (int)auVar166._12_4_;
            auVar169 = vcvtdq2ps_avx(auVar258);
            uVar16 = vcmpps_avx512vl(auVar166,auVar169,1);
            auVar166 = vsubps_avx512vl(auVar169,auVar289);
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar176._0_4_ = (float)((uint)bVar14 * auVar166._0_4_ | (uint)!bVar14 * auVar169._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar176._4_4_ = (float)((uint)bVar14 * auVar166._4_4_ | (uint)!bVar14 * auVar169._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar176._8_4_ = (float)((uint)bVar14 * auVar166._8_4_ | (uint)!bVar14 * auVar169._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar176._12_4_ =
                 (float)((uint)bVar14 * auVar166._12_4_ | (uint)!bVar14 * auVar169._12_4_);
            auVar169 = vfmsub231ps_fma(auVar165,auVar176,auVar294);
            auVar32._8_4_ = 0x395e8083;
            auVar32._0_8_ = 0x395e8083395e8083;
            auVar32._12_4_ = 0x395e8083;
            auVar165 = vfmsub231ps_avx512vl(auVar169,auVar176,auVar32);
            auVar235._0_4_ = auVar165._0_4_ * auVar165._0_4_;
            auVar235._4_4_ = auVar165._4_4_ * auVar165._4_4_;
            auVar235._8_4_ = auVar165._8_4_ * auVar165._8_4_;
            auVar235._12_4_ = auVar165._12_4_ * auVar165._12_4_;
            auVar169 = vfmadd213ps_fma(auVar303,auVar165,auVar307);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar311);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar315);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar319);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar272);
            auVar169 = vfmadd213ps_fma(auVar169,auVar235,auVar165);
            auVar226._0_4_ = auVar169._0_4_ + 1.0;
            auVar226._4_4_ = auVar169._4_4_ + 1.0;
            auVar226._8_4_ = auVar169._8_4_ + 1.0;
            auVar226._12_4_ = auVar169._12_4_ + 1.0;
            auVar236._0_4_ = (int)auVar176._0_4_;
            auVar236._4_4_ = (int)auVar176._4_4_;
            auVar236._8_4_ = (int)auVar176._8_4_;
            auVar236._12_4_ = (int)auVar176._12_4_;
            auVar169 = vpslld_avx(auVar236,0x17);
            auVar169 = vpaddd_avx(auVar323,auVar169);
            auVar169 = vfmadd213ps_fma(auVar169,auVar226,auVar289);
            auVar170 = vdivps_avx(auVar289,auVar169);
            break;
          case 5:
            auVar169 = vminps_avx512vl(auVar225,auVar177);
            auVar166 = vmaxps_avx512vl(auVar169,auVar159);
            auVar165 = vfmadd213ps_fma(auVar160,auVar166,auVar272);
            auVar280._0_4_ = (int)auVar165._0_4_;
            auVar280._4_4_ = (int)auVar165._4_4_;
            auVar280._8_4_ = (int)auVar165._8_4_;
            auVar280._12_4_ = (int)auVar165._12_4_;
            auVar169 = vcvtdq2ps_avx(auVar280);
            uVar16 = vcmpps_avx512vl(auVar165,auVar169,1);
            auVar165 = vsubps_avx512vl(auVar169,auVar289);
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar171._0_4_ = (float)((uint)bVar14 * auVar165._0_4_ | (uint)!bVar14 * auVar169._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar171._4_4_ = (float)((uint)bVar14 * auVar165._4_4_ | (uint)!bVar14 * auVar169._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar171._8_4_ = (float)((uint)bVar14 * auVar165._8_4_ | (uint)!bVar14 * auVar169._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar171._12_4_ =
                 (float)((uint)bVar14 * auVar165._12_4_ | (uint)!bVar14 * auVar169._12_4_);
            auVar169 = vfmsub231ps_fma(auVar166,auVar171,auVar294);
            auVar165 = vfnmsub231ps_fma(auVar169,auVar171,auVar327);
            auVar254._0_4_ = auVar165._0_4_ * auVar165._0_4_;
            auVar254._4_4_ = auVar165._4_4_ * auVar165._4_4_;
            auVar254._8_4_ = auVar165._8_4_ * auVar165._8_4_;
            auVar254._12_4_ = auVar165._12_4_ * auVar165._12_4_;
            auVar169 = vfmadd213ps_fma(auVar303,auVar165,auVar307);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar311);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar315);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar319);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar272);
            auVar169 = vfmadd213ps_fma(auVar169,auVar254,auVar165);
            auVar232._0_4_ = auVar169._0_4_ + 1.0;
            auVar232._4_4_ = auVar169._4_4_ + 1.0;
            auVar232._8_4_ = auVar169._8_4_ + 1.0;
            auVar232._12_4_ = auVar169._12_4_ + 1.0;
            auVar255._0_4_ = (int)auVar171._0_4_;
            auVar255._4_4_ = (int)auVar171._4_4_;
            auVar255._8_4_ = (int)auVar171._8_4_;
            auVar255._12_4_ = (int)auVar171._12_4_;
            auVar169 = vpslld_avx(auVar255,0x17);
            auVar169 = vpaddd_avx(auVar323,auVar169);
            auVar169 = vfmadd213ps_fma(auVar169,auVar232,auVar289);
            uVar16 = vcmpps_avx512vl(auVar169,auVar158,2);
            auVar21._8_4_ = 0x800000;
            auVar21._0_8_ = 0x80000000800000;
            auVar21._12_4_ = 0x800000;
            auVar169 = vmaxps_avx512vl(auVar169,auVar21);
            auVar166 = vpsrld_avx(auVar169,0x17);
            auVar281._8_4_ = 0x807fffff;
            auVar281._0_8_ = 0x807fffff807fffff;
            auVar281._12_4_ = 0x807fffff;
            auVar22._8_4_ = 0x3f000000;
            auVar22._0_8_ = 0x3f0000003f000000;
            auVar22._12_4_ = 0x3f000000;
            auVar169 = vpternlogd_avx512vl(auVar169,auVar281,auVar22,0xea);
            auVar23._8_4_ = 0x3f3504f3;
            auVar23._0_8_ = 0x3f3504f33f3504f3;
            auVar23._12_4_ = 0x3f3504f3;
            uVar17 = vcmpps_avx512vl(auVar169,auVar23,1);
            auVar24._8_4_ = 0xbf800000;
            auVar24._0_8_ = 0xbf800000bf800000;
            auVar24._12_4_ = 0xbf800000;
            auVar165 = vaddps_avx512vl(auVar169,auVar24);
            auVar169 = vaddps_avx512vl(auVar165,auVar169);
            bVar14 = (bool)((byte)uVar17 & 1);
            auVar172._0_4_ = (float)((uint)bVar14 * auVar169._0_4_ | (uint)!bVar14 * auVar165._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar172._4_4_ = (float)((uint)bVar14 * auVar169._4_4_ | (uint)!bVar14 * auVar165._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar172._8_4_ = (float)((uint)bVar14 * auVar169._8_4_ | (uint)!bVar14 * auVar165._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar172._12_4_ =
                 (float)((uint)bVar14 * auVar169._12_4_ | (uint)!bVar14 * auVar165._12_4_);
            auVar233._0_4_ = auVar172._0_4_ * auVar172._0_4_;
            auVar233._4_4_ = auVar172._4_4_ * auVar172._4_4_;
            auVar233._8_4_ = auVar172._8_4_ * auVar172._8_4_;
            auVar233._12_4_ = auVar172._12_4_ * auVar172._12_4_;
            auVar298._8_4_ = 0x3d9021bb;
            auVar298._0_8_ = 0x3d9021bb3d9021bb;
            auVar298._12_4_ = 0x3d9021bb;
            auVar25._8_4_ = 0xbdebd1b8;
            auVar25._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar25._12_4_ = 0xbdebd1b8;
            auVar169 = vfmadd213ps_avx512vl(auVar298,auVar172,auVar25);
            auVar26._8_4_ = 0x3def251a;
            auVar26._0_8_ = 0x3def251a3def251a;
            auVar26._12_4_ = 0x3def251a;
            auVar169 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar26);
            auVar27._8_4_ = 0xbdfe5d4f;
            auVar27._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar27._12_4_ = 0xbdfe5d4f;
            auVar169 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar27);
            auVar28._8_4_ = 0x3e11e9bf;
            auVar28._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar28._12_4_ = 0x3e11e9bf;
            auVar169 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar28);
            auVar29._8_4_ = 0xbe2aae50;
            auVar29._0_8_ = 0xbe2aae50be2aae50;
            auVar29._12_4_ = 0xbe2aae50;
            auVar169 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar29);
            auVar169 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar161);
            auVar169 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar162);
            auVar169 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar163);
            auVar299._0_4_ = auVar233._0_4_ * auVar172._0_4_ * auVar169._0_4_;
            auVar299._4_4_ = auVar233._4_4_ * auVar172._4_4_ * auVar169._4_4_;
            auVar299._8_4_ = auVar233._8_4_ * auVar172._8_4_ * auVar169._8_4_;
            auVar299._12_4_ = auVar233._12_4_ * auVar172._12_4_ * auVar169._12_4_;
            auVar30._8_4_ = 0xffffff82;
            auVar30._0_8_ = 0xffffff82ffffff82;
            auVar30._12_4_ = 0xffffff82;
            auVar169 = vpaddd_avx512vl(auVar166,auVar30);
            auVar169 = vcvtdq2ps_avx(auVar169);
            auVar165 = vsubps_avx512vl(auVar169,auVar289);
            bVar14 = (bool)((byte)uVar17 & 1);
            auVar173._0_4_ = (uint)bVar14 * auVar165._0_4_ | (uint)!bVar14 * auVar169._0_4_;
            bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar173._4_4_ = (uint)bVar14 * auVar165._4_4_ | (uint)!bVar14 * auVar169._4_4_;
            bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar173._8_4_ = (uint)bVar14 * auVar165._8_4_ | (uint)!bVar14 * auVar169._8_4_;
            bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar173._12_4_ = (uint)bVar14 * auVar165._12_4_ | (uint)!bVar14 * auVar169._12_4_;
            auVar169 = vfmadd231ps_fma(auVar299,auVar173,auVar327);
            auVar169 = vfmsub231ps_fma(auVar169,auVar272,auVar233);
            auVar169 = vsubps_avx(auVar169,auVar172);
            auVar169 = vfnmadd231ps_fma(auVar169,auVar294,auVar173);
            auVar165 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar174._0_4_ =
                 (uint)bVar14 * auVar165._0_4_ |
                 (uint)!bVar14 * (int)(auVar169._0_4_ + auVar169._0_4_);
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar174._4_4_ =
                 (uint)bVar14 * auVar165._4_4_ |
                 (uint)!bVar14 * (int)(auVar169._4_4_ + auVar169._4_4_);
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar174._8_4_ =
                 (uint)bVar14 * auVar165._8_4_ |
                 (uint)!bVar14 * (int)(auVar169._8_4_ + auVar169._8_4_);
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar174._12_4_ =
                 (uint)bVar14 * auVar165._12_4_ |
                 (uint)!bVar14 * (int)(auVar169._12_4_ + auVar169._12_4_);
            auVar169 = vminps_avx512vl(auVar174,auVar177);
            auVar166 = vmaxps_avx512vl(auVar169,auVar159);
            auVar165 = vfmadd213ps_fma(auVar160,auVar166,auVar272);
            auVar282._0_4_ = (int)auVar165._0_4_;
            auVar282._4_4_ = (int)auVar165._4_4_;
            auVar282._8_4_ = (int)auVar165._8_4_;
            auVar282._12_4_ = (int)auVar165._12_4_;
            auVar169 = vcvtdq2ps_avx(auVar282);
            uVar16 = vcmpps_avx512vl(auVar165,auVar169,1);
            auVar165 = vsubps_avx512vl(auVar169,auVar289);
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar175._0_4_ = (float)((uint)bVar14 * auVar165._0_4_ | (uint)!bVar14 * auVar169._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar175._4_4_ = (float)((uint)bVar14 * auVar165._4_4_ | (uint)!bVar14 * auVar169._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar175._8_4_ = (float)((uint)bVar14 * auVar165._8_4_ | (uint)!bVar14 * auVar169._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar175._12_4_ =
                 (float)((uint)bVar14 * auVar165._12_4_ | (uint)!bVar14 * auVar169._12_4_);
            auVar169 = vfmsub231ps_fma(auVar166,auVar175,auVar294);
            auVar165 = vfnmsub231ps_fma(auVar169,auVar175,auVar327);
            auVar256._0_4_ = auVar165._0_4_ * auVar165._0_4_;
            auVar256._4_4_ = auVar165._4_4_ * auVar165._4_4_;
            auVar256._8_4_ = auVar165._8_4_ * auVar165._8_4_;
            auVar256._12_4_ = auVar165._12_4_ * auVar165._12_4_;
            auVar169 = vfmadd213ps_fma(auVar303,auVar165,auVar307);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar311);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar315);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar319);
            auVar169 = vfmadd213ps_fma(auVar169,auVar165,auVar272);
            auVar169 = vfmadd213ps_fma(auVar169,auVar256,auVar165);
            auVar234._0_4_ = auVar169._0_4_ + 1.0;
            auVar234._4_4_ = auVar169._4_4_ + 1.0;
            auVar234._8_4_ = auVar169._8_4_ + 1.0;
            auVar234._12_4_ = auVar169._12_4_ + 1.0;
            auVar257._0_4_ = (int)auVar175._0_4_;
            auVar257._4_4_ = (int)auVar175._4_4_;
            auVar257._8_4_ = (int)auVar175._8_4_;
            auVar257._12_4_ = (int)auVar175._12_4_;
            auVar169 = vpslld_avx(auVar257,0x17);
            auVar169 = vpaddd_avx(auVar323,auVar169);
            auVar169 = vfmadd213ps_fma(auVar169,auVar234,auVar289);
            auVar169 = vdivps_avx512vl(auVar164,auVar169);
            auVar170 = vfmsub213ps_fma(auVar169,auVar225,auVar225);
            break;
          case 6:
            puVar11 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar2 = *puVar11;
            auVar237._4_4_ = uVar2;
            auVar237._0_4_ = uVar2;
            auVar237._8_4_ = uVar2;
            auVar237._12_4_ = uVar2;
            uVar2 = puVar11[1];
            auVar20._4_4_ = uVar2;
            auVar20._0_4_ = uVar2;
            auVar20._8_4_ = uVar2;
            auVar20._12_4_ = uVar2;
            auVar169 = vfmadd213ps_avx512vl(auVar237,auVar225,auVar20);
            auVar169 = vmaxps_avx512vl(auVar169,auVar158);
            auVar169 = vminps_avx(auVar169,auVar289);
            auVar170._0_4_ = auVar169._0_4_ * auVar225._0_4_;
            auVar170._4_4_ = auVar169._4_4_ * auVar225._4_4_;
            auVar170._8_4_ = auVar169._8_4_ * auVar225._8_4_;
            auVar170._12_4_ = auVar169._12_4_ * auVar225._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar140 * 0x10) = auVar170;
      }
    }
    else if (iVar152 == 8) {
      if ((int)uVar6 < 1) {
        uVar140 = 0;
      }
      auVar185 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar186 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar277._8_4_ = 0x3f000000;
      auVar277._0_8_ = 0x3f0000003f000000;
      auVar277._12_4_ = 0x3f000000;
      auVar277._16_4_ = 0x3f000000;
      auVar277._20_4_ = 0x3f000000;
      auVar277._24_4_ = 0x3f000000;
      auVar277._28_4_ = 0x3f000000;
      auVar286._8_4_ = 0x3fb8aa3b;
      auVar286._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar286._12_4_ = 0x3fb8aa3b;
      auVar286._16_4_ = 0x3fb8aa3b;
      auVar286._20_4_ = 0x3fb8aa3b;
      auVar286._24_4_ = 0x3fb8aa3b;
      auVar286._28_4_ = 0x3fb8aa3b;
      auVar291._8_4_ = 0x3f800000;
      auVar291._0_8_ = 0x3f8000003f800000;
      auVar291._12_4_ = 0x3f800000;
      auVar291._16_4_ = 0x3f800000;
      auVar291._20_4_ = 0x3f800000;
      auVar291._24_4_ = 0x3f800000;
      auVar291._28_4_ = 0x3f800000;
      auVar296._8_4_ = 0x3f318000;
      auVar296._0_8_ = 0x3f3180003f318000;
      auVar296._12_4_ = 0x3f318000;
      auVar296._16_4_ = 0x3f318000;
      auVar296._20_4_ = 0x3f318000;
      auVar296._24_4_ = 0x3f318000;
      auVar296._28_4_ = 0x3f318000;
      auVar305._8_4_ = 0x39506967;
      auVar305._0_8_ = 0x3950696739506967;
      auVar305._12_4_ = 0x39506967;
      auVar305._16_4_ = 0x39506967;
      auVar305._20_4_ = 0x39506967;
      auVar305._24_4_ = 0x39506967;
      auVar305._28_4_ = 0x39506967;
      auVar309._8_4_ = 0x3ab743ce;
      auVar309._0_8_ = 0x3ab743ce3ab743ce;
      auVar309._12_4_ = 0x3ab743ce;
      auVar309._16_4_ = 0x3ab743ce;
      auVar309._20_4_ = 0x3ab743ce;
      auVar309._24_4_ = 0x3ab743ce;
      auVar309._28_4_ = 0x3ab743ce;
      auVar313._8_4_ = 0x3c088908;
      auVar313._0_8_ = 0x3c0889083c088908;
      auVar313._12_4_ = 0x3c088908;
      auVar313._16_4_ = 0x3c088908;
      auVar313._20_4_ = 0x3c088908;
      auVar313._24_4_ = 0x3c088908;
      auVar313._28_4_ = 0x3c088908;
      auVar317._8_4_ = 0x3d2aa9c1;
      auVar317._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar317._12_4_ = 0x3d2aa9c1;
      auVar317._16_4_ = 0x3d2aa9c1;
      auVar317._20_4_ = 0x3d2aa9c1;
      auVar317._24_4_ = 0x3d2aa9c1;
      auVar317._28_4_ = 0x3d2aa9c1;
      auVar321._8_4_ = 0x3e2aaaaa;
      auVar321._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar321._12_4_ = 0x3e2aaaaa;
      auVar321._16_4_ = 0x3e2aaaaa;
      auVar321._20_4_ = 0x3e2aaaaa;
      auVar321._24_4_ = 0x3e2aaaaa;
      auVar321._28_4_ = 0x3e2aaaaa;
      auVar325._8_4_ = 0x3f800000;
      auVar325._0_8_ = 0x3f8000003f800000;
      auVar325._12_4_ = 0x3f800000;
      auVar325._16_4_ = 0x3f800000;
      auVar325._20_4_ = 0x3f800000;
      auVar325._24_4_ = 0x3f800000;
      auVar325._28_4_ = 0x3f800000;
      auVar329._8_4_ = 0xb95e8083;
      auVar329._0_8_ = 0xb95e8083b95e8083;
      auVar329._12_4_ = 0xb95e8083;
      auVar329._16_4_ = 0xb95e8083;
      auVar329._20_4_ = 0xb95e8083;
      auVar329._24_4_ = 0xb95e8083;
      auVar329._28_4_ = 0xb95e8083;
      auVar187 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar188 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar189 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar190 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar191 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar158 = vxorps_avx512vl(auVar158,auVar158);
      auVar192 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      for (uVar138 = 0; uVar138 != uVar140; uVar138 = uVar138 + 1) {
        auVar209 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar208 = ZEXT1664(ZEXT816(0) << 0x40);
        if (pvVar8 != (void *)0x0) {
          auVar208 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar8 + uVar138 * 0x20));
        }
        pauVar139 = (undefined1 (*) [32])
                    ((long)(this->weight_data_tm).w * uVar138 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        lVar141 = 0;
        auVar210 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar177 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar177);
        auVar177 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar177);
        auVar177 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar177);
        auVar177 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar177);
        auVar177 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar177);
        iVar152 = 0;
        pauVar149 = local_368;
        while( true ) {
          if (iVar144 <= iVar152 + 7) break;
          auVar195 = vlddqu_avx(*pauVar139);
          auVar196 = vlddqu_avx(pauVar139[1]);
          auVar193 = vcvtph2ps_avx512vl(auVar195._0_16_);
          auVar195 = vcvtph2ps_f16c(auVar195._16_16_);
          auVar194 = vcvtph2ps_avx512vl(auVar196._0_16_);
          auVar196 = vcvtph2ps_f16c(auVar196._16_16_);
          uVar2 = *(undefined4 *)*pauVar149;
          auVar62._4_4_ = uVar2;
          auVar62._0_4_ = uVar2;
          auVar62._8_4_ = uVar2;
          auVar62._12_4_ = uVar2;
          auVar62._16_4_ = uVar2;
          auVar62._20_4_ = uVar2;
          auVar62._24_4_ = uVar2;
          auVar62._28_4_ = uVar2;
          auVar193 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar193,auVar62);
          auVar208 = ZEXT3264(auVar193);
          uVar2 = *(undefined4 *)(*pauVar149 + 4);
          auVar63._4_4_ = uVar2;
          auVar63._0_4_ = uVar2;
          auVar63._8_4_ = uVar2;
          auVar63._12_4_ = uVar2;
          auVar63._16_4_ = uVar2;
          auVar63._20_4_ = uVar2;
          auVar63._24_4_ = uVar2;
          auVar63._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(in_ZMM22._0_32_,auVar195,auVar63);
          in_ZMM22 = ZEXT3264(auVar195);
          uVar2 = *(undefined4 *)(*pauVar149 + 8);
          auVar64._4_4_ = uVar2;
          auVar64._0_4_ = uVar2;
          auVar64._8_4_ = uVar2;
          auVar64._12_4_ = uVar2;
          auVar64._16_4_ = uVar2;
          auVar64._20_4_ = uVar2;
          auVar64._24_4_ = uVar2;
          auVar64._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar194,auVar64);
          in_ZMM19 = ZEXT3264(auVar195);
          uVar2 = *(undefined4 *)(*pauVar149 + 0xc);
          auVar65._4_4_ = uVar2;
          auVar65._0_4_ = uVar2;
          auVar65._8_4_ = uVar2;
          auVar65._12_4_ = uVar2;
          auVar65._16_4_ = uVar2;
          auVar65._20_4_ = uVar2;
          auVar65._24_4_ = uVar2;
          auVar65._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar196,auVar65);
          in_ZMM17 = ZEXT3264(auVar195);
          auVar195 = vlddqu_avx(pauVar139[2]);
          auVar196 = vlddqu_avx(pauVar139[3]);
          auVar193 = vcvtph2ps_avx512vl(auVar195._0_16_);
          auVar195 = vcvtph2ps_f16c(auVar195._16_16_);
          auVar194 = vcvtph2ps_avx512vl(auVar196._0_16_);
          auVar196 = vcvtph2ps_f16c(auVar196._16_16_);
          uVar2 = *(undefined4 *)(*pauVar149 + 0x10);
          auVar66._4_4_ = uVar2;
          auVar66._0_4_ = uVar2;
          auVar66._8_4_ = uVar2;
          auVar66._12_4_ = uVar2;
          auVar66._16_4_ = uVar2;
          auVar66._20_4_ = uVar2;
          auVar66._24_4_ = uVar2;
          auVar66._28_4_ = uVar2;
          auVar193 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar193,auVar66);
          in_ZMM18 = ZEXT3264(auVar193);
          uVar2 = *(undefined4 *)(*pauVar149 + 0x14);
          auVar67._4_4_ = uVar2;
          auVar67._0_4_ = uVar2;
          auVar67._8_4_ = uVar2;
          auVar67._12_4_ = uVar2;
          auVar67._16_4_ = uVar2;
          auVar67._20_4_ = uVar2;
          auVar67._24_4_ = uVar2;
          auVar67._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar195,auVar67);
          in_ZMM16 = ZEXT3264(auVar195);
          uVar2 = *(undefined4 *)(*pauVar149 + 0x18);
          auVar68._4_4_ = uVar2;
          auVar68._0_4_ = uVar2;
          auVar68._8_4_ = uVar2;
          auVar68._12_4_ = uVar2;
          auVar68._16_4_ = uVar2;
          auVar68._20_4_ = uVar2;
          auVar68._24_4_ = uVar2;
          auVar68._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(auVar210._0_32_,auVar194,auVar68);
          auVar210 = ZEXT3264(auVar195);
          uVar2 = *(undefined4 *)(*pauVar149 + 0x1c);
          auVar69._4_4_ = uVar2;
          auVar69._0_4_ = uVar2;
          auVar69._8_4_ = uVar2;
          auVar69._12_4_ = uVar2;
          auVar69._16_4_ = uVar2;
          auVar69._20_4_ = uVar2;
          auVar69._24_4_ = uVar2;
          auVar69._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(auVar209._0_32_,auVar196,auVar69);
          auVar209 = ZEXT3264(auVar195);
          pauVar149 = pauVar149 + 1;
          pauVar139 = pauVar139 + 4;
          iVar152 = iVar152 + 8;
          lVar141 = lVar141 + 8;
        }
        while( true ) {
          if (iVar144 <= iVar152 + 3) break;
          auVar195 = vlddqu_avx(*pauVar139);
          auVar196 = vlddqu_avx(pauVar139[1]);
          auVar193 = vcvtph2ps_avx512vl(auVar195._0_16_);
          auVar195 = vcvtph2ps_f16c(auVar195._16_16_);
          auVar194 = vcvtph2ps_avx512vl(auVar196._0_16_);
          auVar196 = vcvtph2ps_f16c(auVar196._16_16_);
          uVar2 = *(undefined4 *)*pauVar149;
          auVar71._4_4_ = uVar2;
          auVar71._0_4_ = uVar2;
          auVar71._8_4_ = uVar2;
          auVar71._12_4_ = uVar2;
          auVar71._16_4_ = uVar2;
          auVar71._20_4_ = uVar2;
          auVar71._24_4_ = uVar2;
          auVar71._28_4_ = uVar2;
          auVar193 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar193,auVar71);
          auVar208 = ZEXT3264(auVar193);
          uVar2 = *(undefined4 *)(*pauVar149 + 4);
          auVar72._4_4_ = uVar2;
          auVar72._0_4_ = uVar2;
          auVar72._8_4_ = uVar2;
          auVar72._12_4_ = uVar2;
          auVar72._16_4_ = uVar2;
          auVar72._20_4_ = uVar2;
          auVar72._24_4_ = uVar2;
          auVar72._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(in_ZMM22._0_32_,auVar195,auVar72);
          in_ZMM22 = ZEXT3264(auVar195);
          uVar2 = *(undefined4 *)(*pauVar149 + 8);
          auVar73._4_4_ = uVar2;
          auVar73._0_4_ = uVar2;
          auVar73._8_4_ = uVar2;
          auVar73._12_4_ = uVar2;
          auVar73._16_4_ = uVar2;
          auVar73._20_4_ = uVar2;
          auVar73._24_4_ = uVar2;
          auVar73._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar194,auVar73);
          in_ZMM19 = ZEXT3264(auVar195);
          uVar2 = *(undefined4 *)(*pauVar149 + 0xc);
          auVar74._4_4_ = uVar2;
          auVar74._0_4_ = uVar2;
          auVar74._8_4_ = uVar2;
          auVar74._12_4_ = uVar2;
          auVar74._16_4_ = uVar2;
          auVar74._20_4_ = uVar2;
          auVar74._24_4_ = uVar2;
          auVar74._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar196,auVar74);
          in_ZMM17 = ZEXT3264(auVar195);
          pauVar149 = (undefined1 (*) [32])(*pauVar149 + 0x10);
          pauVar139 = pauVar139 + 2;
          iVar152 = iVar152 + 4;
          lVar141 = lVar141 + 4;
        }
        for (; (int)lVar141 < iVar144; lVar141 = lVar141 + 1) {
          auVar177 = vlddqu_avx(*(undefined1 (*) [16])*pauVar139);
          auVar195 = vcvtph2ps_f16c(auVar177);
          uVar2 = *(undefined4 *)(*local_368 + lVar141 * 4);
          auVar70._4_4_ = uVar2;
          auVar70._0_4_ = uVar2;
          auVar70._8_4_ = uVar2;
          auVar70._12_4_ = uVar2;
          auVar70._16_4_ = uVar2;
          auVar70._20_4_ = uVar2;
          auVar70._24_4_ = uVar2;
          auVar70._28_4_ = uVar2;
          auVar195 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar195,auVar70);
          auVar208 = ZEXT3264(auVar195);
          pauVar139 = (undefined1 (*) [32])(*pauVar139 + 0x10);
        }
        auVar195 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM18._0_32_);
        auVar196 = vaddps_avx512vl(in_ZMM17._0_32_,in_ZMM19._0_32_);
        auVar196 = vaddps_avx512vl(auVar196,in_ZMM22._0_32_);
        auVar229._0_4_ =
             auVar210._0_4_ + auVar209._0_4_ + auVar195._0_4_ + auVar196._0_4_ + auVar208._0_4_;
        auVar229._4_4_ =
             auVar210._4_4_ + auVar209._4_4_ + auVar195._4_4_ + auVar196._4_4_ + auVar208._4_4_;
        auVar229._8_4_ =
             auVar210._8_4_ + auVar209._8_4_ + auVar195._8_4_ + auVar196._8_4_ + auVar208._8_4_;
        auVar229._12_4_ =
             auVar210._12_4_ + auVar209._12_4_ + auVar195._12_4_ + auVar196._12_4_ + auVar208._12_4_
        ;
        auVar229._16_4_ =
             auVar210._16_4_ + auVar209._16_4_ + auVar195._16_4_ + auVar196._16_4_ + auVar208._16_4_
        ;
        auVar229._20_4_ =
             auVar210._20_4_ + auVar209._20_4_ + auVar195._20_4_ + auVar196._20_4_ + auVar208._20_4_
        ;
        auVar229._24_4_ =
             auVar210._24_4_ + auVar209._24_4_ + auVar195._24_4_ + auVar196._24_4_ + auVar208._24_4_
        ;
        auVar229._28_4_ =
             auVar210._28_4_ + auVar209._28_4_ + auVar195._28_4_ + auVar196._28_4_ + auVar208._28_4_
        ;
        auVar197 = auVar229;
        if (5 < iVar136 - 1U) goto switchD_0029c934_caseD_1;
        auVar197 = vmaxps_avx512vl(auVar229,ZEXT1632(auVar158));
        switch(iVar136) {
        case 2:
          auVar195 = vminps_avx512vl(auVar229,ZEXT1632(auVar158));
          uVar2 = *(this->super_InnerProduct).activation_params.data;
          auVar88._4_4_ = uVar2;
          auVar88._0_4_ = uVar2;
          auVar88._8_4_ = uVar2;
          auVar88._12_4_ = uVar2;
          auVar88._16_4_ = uVar2;
          auVar88._20_4_ = uVar2;
          auVar88._24_4_ = uVar2;
          auVar88._28_4_ = uVar2;
          auVar197 = vfmadd231ps_avx512vl(auVar197,auVar195,auVar88);
          break;
        case 3:
          puVar11 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar2 = *puVar11;
          auVar86._4_4_ = uVar2;
          auVar86._0_4_ = uVar2;
          auVar86._8_4_ = uVar2;
          auVar86._12_4_ = uVar2;
          auVar86._16_4_ = uVar2;
          auVar86._20_4_ = uVar2;
          auVar86._24_4_ = uVar2;
          auVar86._28_4_ = uVar2;
          auVar195 = vmaxps_avx512vl(auVar229,auVar86);
          uVar2 = puVar11[1];
          auVar87._4_4_ = uVar2;
          auVar87._0_4_ = uVar2;
          auVar87._8_4_ = uVar2;
          auVar87._12_4_ = uVar2;
          auVar87._16_4_ = uVar2;
          auVar87._20_4_ = uVar2;
          auVar87._24_4_ = uVar2;
          auVar87._28_4_ = uVar2;
          auVar197 = vminps_avx512vl(auVar195,auVar87);
          break;
        case 4:
          auVar84._8_4_ = 0x80000000;
          auVar84._0_8_ = 0x8000000080000000;
          auVar84._12_4_ = 0x80000000;
          auVar84._16_4_ = 0x80000000;
          auVar84._20_4_ = 0x80000000;
          auVar84._24_4_ = 0x80000000;
          auVar84._28_4_ = 0x80000000;
          auVar195 = vxorps_avx512vl(auVar229,auVar84);
          auVar195 = vminps_avx512vl(auVar195,auVar185);
          auVar196 = vmaxps_avx512vl(auVar195,auVar186);
          auVar177 = vfmadd231ps_fma(auVar277,auVar196,auVar286);
          auVar195 = vroundps_avx(ZEXT1632(auVar177),1);
          uVar16 = vcmpps_avx512vl(ZEXT1632(auVar177),auVar195,1);
          auVar193 = vsubps_avx512vl(auVar195,auVar291);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar202._0_4_ = (float)((uint)bVar14 * auVar193._0_4_ | (uint)!bVar14 * auVar195._0_4_);
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar202._4_4_ = (float)((uint)bVar14 * auVar193._4_4_ | (uint)!bVar14 * auVar195._4_4_);
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar202._8_4_ = (float)((uint)bVar14 * auVar193._8_4_ | (uint)!bVar14 * auVar195._8_4_);
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar202._12_4_ =
               (float)((uint)bVar14 * auVar193._12_4_ | (uint)!bVar14 * auVar195._12_4_);
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar202._16_4_ =
               (float)((uint)bVar14 * auVar193._16_4_ | (uint)!bVar14 * auVar195._16_4_);
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar202._20_4_ =
               (float)((uint)bVar14 * auVar193._20_4_ | (uint)!bVar14 * auVar195._20_4_);
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar202._24_4_ =
               (float)((uint)bVar14 * auVar193._24_4_ | (uint)!bVar14 * auVar195._24_4_);
          bVar14 = SUB81(uVar16 >> 7,0);
          auVar202._28_4_ =
               (float)((uint)bVar14 * auVar193._28_4_ | (uint)!bVar14 * auVar195._28_4_);
          auVar177 = vfmsub231ps_fma(auVar196,auVar202,auVar296);
          auVar85._8_4_ = 0x395e8083;
          auVar85._0_8_ = 0x395e8083395e8083;
          auVar85._12_4_ = 0x395e8083;
          auVar85._16_4_ = 0x395e8083;
          auVar85._20_4_ = 0x395e8083;
          auVar85._24_4_ = 0x395e8083;
          auVar85._28_4_ = 0x395e8083;
          auVar195 = vfmsub231ps_avx512vl(ZEXT1632(auVar177),auVar202,auVar85);
          auVar247._0_4_ = auVar195._0_4_ * auVar195._0_4_;
          auVar247._4_4_ = auVar195._4_4_ * auVar195._4_4_;
          auVar247._8_4_ = auVar195._8_4_ * auVar195._8_4_;
          auVar247._12_4_ = auVar195._12_4_ * auVar195._12_4_;
          auVar247._16_4_ = auVar195._16_4_ * auVar195._16_4_;
          auVar247._20_4_ = auVar195._20_4_ * auVar195._20_4_;
          auVar247._24_4_ = auVar195._24_4_ * auVar195._24_4_;
          auVar247._28_4_ = 0;
          auVar177 = vfmadd213ps_fma(auVar305,auVar195,auVar309);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar313);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar317);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar321);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar277);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar247,auVar195);
          auVar230._0_4_ = auVar177._0_4_ + 1.0;
          auVar230._4_4_ = auVar177._4_4_ + 1.0;
          auVar230._8_4_ = auVar177._8_4_ + 1.0;
          auVar230._12_4_ = auVar177._12_4_ + 1.0;
          auVar230._16_4_ = 0x3f800000;
          auVar230._20_4_ = 0x3f800000;
          auVar230._24_4_ = 0x3f800000;
          auVar230._28_4_ = 0x3f800000;
          auVar248._0_4_ = (int)auVar202._0_4_;
          auVar248._4_4_ = (int)auVar202._4_4_;
          auVar248._8_4_ = (int)auVar202._8_4_;
          auVar248._12_4_ = (int)auVar202._12_4_;
          auVar248._16_4_ = (int)auVar202._16_4_;
          auVar248._20_4_ = (int)auVar202._20_4_;
          auVar248._24_4_ = (int)auVar202._24_4_;
          auVar248._28_4_ = (int)auVar202._28_4_;
          auVar195 = vpslld_avx2(auVar248,0x17);
          auVar195 = vpaddd_avx2(auVar325,auVar195);
          auVar177 = vfmadd213ps_fma(auVar195,auVar230,auVar291);
          auVar197 = vdivps_avx(auVar291,ZEXT1632(auVar177));
          break;
        case 5:
          auVar195 = vminps_avx512vl(auVar229,auVar185);
          auVar196 = vmaxps_avx512vl(auVar195,auVar186);
          auVar177 = vfmadd213ps_fma(auVar286,auVar196,auVar277);
          auVar195 = vroundps_avx(ZEXT1632(auVar177),1);
          uVar16 = vcmpps_avx512vl(ZEXT1632(auVar177),auVar195,1);
          auVar193 = vsubps_avx512vl(auVar195,auVar291);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar198._0_4_ = (float)((uint)bVar14 * auVar193._0_4_ | (uint)!bVar14 * auVar195._0_4_);
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar198._4_4_ = (float)((uint)bVar14 * auVar193._4_4_ | (uint)!bVar14 * auVar195._4_4_);
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar198._8_4_ = (float)((uint)bVar14 * auVar193._8_4_ | (uint)!bVar14 * auVar195._8_4_);
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar198._12_4_ =
               (float)((uint)bVar14 * auVar193._12_4_ | (uint)!bVar14 * auVar195._12_4_);
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar198._16_4_ =
               (float)((uint)bVar14 * auVar193._16_4_ | (uint)!bVar14 * auVar195._16_4_);
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar198._20_4_ =
               (float)((uint)bVar14 * auVar193._20_4_ | (uint)!bVar14 * auVar195._20_4_);
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar198._24_4_ =
               (float)((uint)bVar14 * auVar193._24_4_ | (uint)!bVar14 * auVar195._24_4_);
          bVar14 = SUB81(uVar16 >> 7,0);
          auVar198._28_4_ =
               (float)((uint)bVar14 * auVar193._28_4_ | (uint)!bVar14 * auVar195._28_4_);
          auVar177 = vfmsub231ps_fma(auVar196,auVar198,auVar296);
          auVar159 = vfnmsub231ps_fma(ZEXT1632(auVar177),auVar198,auVar329);
          auVar195 = ZEXT1632(auVar159);
          auVar177 = vfmadd213ps_fma(auVar305,auVar195,auVar309);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar313);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar317);
          auVar195 = ZEXT1632(auVar159);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar321);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar277);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),
                                     ZEXT1632(CONCAT412(auVar159._12_4_ * auVar159._12_4_,
                                                        CONCAT48(auVar159._8_4_ * auVar159._8_4_,
                                                                 CONCAT44(auVar159._4_4_ *
                                                                          auVar159._4_4_,
                                                                          auVar159._0_4_ *
                                                                          auVar159._0_4_)))),
                                     auVar195);
          auVar245._0_4_ = auVar177._0_4_ + 1.0;
          auVar245._4_4_ = auVar177._4_4_ + 1.0;
          auVar245._8_4_ = auVar177._8_4_ + 1.0;
          auVar245._12_4_ = auVar177._12_4_ + 1.0;
          auVar245._16_4_ = 0x3f800000;
          auVar245._20_4_ = 0x3f800000;
          auVar245._24_4_ = 0x3f800000;
          auVar245._28_4_ = 0x3f800000;
          auVar264._0_4_ = (int)auVar198._0_4_;
          auVar264._4_4_ = (int)auVar198._4_4_;
          auVar264._8_4_ = (int)auVar198._8_4_;
          auVar264._12_4_ = (int)auVar198._12_4_;
          auVar264._16_4_ = (int)auVar198._16_4_;
          auVar264._20_4_ = (int)auVar198._20_4_;
          auVar264._24_4_ = (int)auVar198._24_4_;
          auVar264._28_4_ = (int)auVar198._28_4_;
          auVar195 = vpslld_avx2(auVar264,0x17);
          auVar195 = vpaddd_avx2(auVar325,auVar195);
          auVar177 = vfmadd213ps_fma(auVar195,auVar245,auVar291);
          uVar16 = vcmpps_avx512vl(ZEXT1632(auVar177),ZEXT1632(auVar158),2);
          auVar76._8_4_ = 0x800000;
          auVar76._0_8_ = 0x80000000800000;
          auVar76._12_4_ = 0x800000;
          auVar76._16_4_ = 0x800000;
          auVar76._20_4_ = 0x800000;
          auVar76._24_4_ = 0x800000;
          auVar76._28_4_ = 0x800000;
          auVar195 = vmaxps_avx512vl(ZEXT1632(auVar177),auVar76);
          auVar194 = vpsrld_avx2(auVar195,0x17);
          auVar301._8_4_ = 0x807fffff;
          auVar301._0_8_ = 0x807fffff807fffff;
          auVar301._12_4_ = 0x807fffff;
          auVar301._16_4_ = 0x807fffff;
          auVar301._20_4_ = 0x807fffff;
          auVar301._24_4_ = 0x807fffff;
          auVar301._28_4_ = 0x807fffff;
          auVar77._8_4_ = 0x3f000000;
          auVar77._0_8_ = 0x3f0000003f000000;
          auVar77._12_4_ = 0x3f000000;
          auVar77._16_4_ = 0x3f000000;
          auVar77._20_4_ = 0x3f000000;
          auVar77._24_4_ = 0x3f000000;
          auVar77._28_4_ = 0x3f000000;
          auVar195 = vpternlogd_avx512vl(auVar195,auVar301,auVar77,0xea);
          auVar78._8_4_ = 0x3f3504f3;
          auVar78._0_8_ = 0x3f3504f33f3504f3;
          auVar78._12_4_ = 0x3f3504f3;
          auVar78._16_4_ = 0x3f3504f3;
          auVar78._20_4_ = 0x3f3504f3;
          auVar78._24_4_ = 0x3f3504f3;
          auVar78._28_4_ = 0x3f3504f3;
          uVar17 = vcmpps_avx512vl(auVar195,auVar78,1);
          auVar196 = vaddps_avx512vl(auVar195,auVar187);
          auVar193 = vaddps_avx512vl(auVar196,auVar195);
          bVar14 = (bool)((byte)uVar17 & 1);
          auVar199._0_4_ = (float)((uint)bVar14 * auVar193._0_4_ | (uint)!bVar14 * auVar196._0_4_);
          bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar199._4_4_ = (float)((uint)bVar14 * auVar193._4_4_ | (uint)!bVar14 * auVar196._4_4_);
          bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar199._8_4_ = (float)((uint)bVar14 * auVar193._8_4_ | (uint)!bVar14 * auVar196._8_4_);
          bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar199._12_4_ =
               (float)((uint)bVar14 * auVar193._12_4_ | (uint)!bVar14 * auVar196._12_4_);
          bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar199._16_4_ =
               (float)((uint)bVar14 * auVar193._16_4_ | (uint)!bVar14 * auVar196._16_4_);
          bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar199._20_4_ =
               (float)((uint)bVar14 * auVar193._20_4_ | (uint)!bVar14 * auVar196._20_4_);
          bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar199._24_4_ =
               (float)((uint)bVar14 * auVar193._24_4_ | (uint)!bVar14 * auVar196._24_4_);
          bVar14 = SUB81(uVar17 >> 7,0);
          auVar199._28_4_ = (uint)bVar14 * auVar193._28_4_ | (uint)!bVar14 * auVar196._28_4_;
          auVar120._4_4_ = auVar199._4_4_ * auVar199._4_4_;
          auVar120._0_4_ = auVar199._0_4_ * auVar199._0_4_;
          auVar120._8_4_ = auVar199._8_4_ * auVar199._8_4_;
          auVar120._12_4_ = auVar199._12_4_ * auVar199._12_4_;
          auVar120._16_4_ = auVar199._16_4_ * auVar199._16_4_;
          auVar120._20_4_ = auVar199._20_4_ * auVar199._20_4_;
          auVar120._24_4_ = auVar199._24_4_ * auVar199._24_4_;
          auVar120._28_4_ = auVar195._28_4_;
          auVar332._8_4_ = 0x3d9021bb;
          auVar332._0_8_ = 0x3d9021bb3d9021bb;
          auVar332._12_4_ = 0x3d9021bb;
          auVar332._16_4_ = 0x3d9021bb;
          auVar332._20_4_ = 0x3d9021bb;
          auVar332._24_4_ = 0x3d9021bb;
          auVar332._28_4_ = 0x3d9021bb;
          auVar79._8_4_ = 0xbdebd1b8;
          auVar79._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar79._12_4_ = 0xbdebd1b8;
          auVar79._16_4_ = 0xbdebd1b8;
          auVar79._20_4_ = 0xbdebd1b8;
          auVar79._24_4_ = 0xbdebd1b8;
          auVar79._28_4_ = 0xbdebd1b8;
          auVar195 = vfmadd213ps_avx512vl(auVar332,auVar199,auVar79);
          auVar80._8_4_ = 0x3def251a;
          auVar80._0_8_ = 0x3def251a3def251a;
          auVar80._12_4_ = 0x3def251a;
          auVar80._16_4_ = 0x3def251a;
          auVar80._20_4_ = 0x3def251a;
          auVar80._24_4_ = 0x3def251a;
          auVar80._28_4_ = 0x3def251a;
          auVar195 = vfmadd213ps_avx512vl(auVar195,auVar199,auVar80);
          auVar81._8_4_ = 0xbdfe5d4f;
          auVar81._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar81._12_4_ = 0xbdfe5d4f;
          auVar81._16_4_ = 0xbdfe5d4f;
          auVar81._20_4_ = 0xbdfe5d4f;
          auVar81._24_4_ = 0xbdfe5d4f;
          auVar81._28_4_ = 0xbdfe5d4f;
          auVar195 = vfmadd213ps_avx512vl(auVar195,auVar199,auVar81);
          auVar82._8_4_ = 0x3e11e9bf;
          auVar82._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar82._12_4_ = 0x3e11e9bf;
          auVar82._16_4_ = 0x3e11e9bf;
          auVar82._20_4_ = 0x3e11e9bf;
          auVar82._24_4_ = 0x3e11e9bf;
          auVar82._28_4_ = 0x3e11e9bf;
          auVar195 = vfmadd213ps_avx512vl(auVar195,auVar199,auVar82);
          auVar195 = vfmadd213ps_avx512vl(auVar195,auVar199,auVar188);
          auVar195 = vfmadd213ps_avx512vl(auVar195,auVar199,auVar189);
          auVar195 = vfmadd213ps_avx512vl(auVar195,auVar199,auVar190);
          auVar195 = vfmadd213ps_avx512vl(auVar195,auVar199,auVar191);
          auVar196 = vmulps_avx512vl(auVar120,auVar199);
          in_ZMM16 = ZEXT3264(auVar196);
          auVar196 = vmulps_avx512vl(auVar196,auVar195);
          auVar83._8_4_ = 0xffffff82;
          auVar83._0_8_ = 0xffffff82ffffff82;
          auVar83._12_4_ = 0xffffff82;
          auVar83._16_4_ = 0xffffff82;
          auVar83._20_4_ = 0xffffff82;
          auVar83._24_4_ = 0xffffff82;
          auVar83._28_4_ = 0xffffff82;
          auVar195 = vpaddd_avx512vl(auVar194,auVar83);
          auVar195 = vcvtdq2ps_avx(auVar195);
          auVar193 = vsubps_avx512vl(auVar195,auVar291);
          bVar14 = (bool)((byte)uVar17 & 1);
          auVar200._0_4_ = (uint)bVar14 * auVar193._0_4_ | (uint)!bVar14 * auVar195._0_4_;
          bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar200._4_4_ = (uint)bVar14 * auVar193._4_4_ | (uint)!bVar14 * auVar195._4_4_;
          bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar200._8_4_ = (uint)bVar14 * auVar193._8_4_ | (uint)!bVar14 * auVar195._8_4_;
          bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar200._12_4_ = (uint)bVar14 * auVar193._12_4_ | (uint)!bVar14 * auVar195._12_4_;
          bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar200._16_4_ = (uint)bVar14 * auVar193._16_4_ | (uint)!bVar14 * auVar195._16_4_;
          bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar200._20_4_ = (uint)bVar14 * auVar193._20_4_ | (uint)!bVar14 * auVar195._20_4_;
          bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar200._24_4_ = (uint)bVar14 * auVar193._24_4_ | (uint)!bVar14 * auVar195._24_4_;
          bVar14 = SUB81(uVar17 >> 7,0);
          auVar200._28_4_ = (uint)bVar14 * auVar193._28_4_ | (uint)!bVar14 * auVar195._28_4_;
          auVar177 = vfmadd231ps_fma(auVar196,auVar200,auVar329);
          auVar177 = vfmsub231ps_fma(ZEXT1632(auVar177),auVar277,auVar120);
          auVar195 = vsubps_avx(ZEXT1632(auVar177),auVar199);
          auVar177 = vfmsub231ps_fma(auVar195,auVar296,auVar200);
          auVar195 = vmulps_avx512vl(ZEXT1632(auVar177),auVar192);
          auVar196 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar201._0_4_ = (uint)bVar14 * auVar196._0_4_ | (uint)!bVar14 * auVar195._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar201._4_4_ = (uint)bVar14 * auVar196._4_4_ | (uint)!bVar14 * auVar195._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar201._8_4_ = (uint)bVar14 * auVar196._8_4_ | (uint)!bVar14 * auVar195._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar201._12_4_ = (uint)bVar14 * auVar196._12_4_ | (uint)!bVar14 * auVar195._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar201._16_4_ = (uint)bVar14 * auVar196._16_4_ | (uint)!bVar14 * auVar195._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar201._20_4_ = (uint)bVar14 * auVar196._20_4_ | (uint)!bVar14 * auVar195._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar201._24_4_ = (uint)bVar14 * auVar196._24_4_ | (uint)!bVar14 * auVar195._24_4_;
          bVar14 = SUB81(uVar16 >> 7,0);
          auVar201._28_4_ = (uint)bVar14 * auVar196._28_4_ | (uint)!bVar14 * auVar195._28_4_;
          auVar195 = vminps_avx512vl(auVar201,auVar185);
          auVar196 = vmaxps_avx512vl(auVar195,auVar186);
          auVar177 = vfmadd213ps_fma(auVar286,auVar196,auVar277);
          auVar195 = vroundps_avx(ZEXT1632(auVar177),1);
          uVar16 = vcmpps_avx512vl(ZEXT1632(auVar177),auVar195,1);
          auVar193 = vsubps_avx512vl(auVar195,auVar291);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar197._0_4_ = (float)((uint)bVar14 * auVar193._0_4_ | (uint)!bVar14 * auVar195._0_4_);
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar197._4_4_ = (float)((uint)bVar14 * auVar193._4_4_ | (uint)!bVar14 * auVar195._4_4_);
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar197._8_4_ = (float)((uint)bVar14 * auVar193._8_4_ | (uint)!bVar14 * auVar195._8_4_);
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar197._12_4_ =
               (float)((uint)bVar14 * auVar193._12_4_ | (uint)!bVar14 * auVar195._12_4_);
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar197._16_4_ =
               (float)((uint)bVar14 * auVar193._16_4_ | (uint)!bVar14 * auVar195._16_4_);
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar197._20_4_ =
               (float)((uint)bVar14 * auVar193._20_4_ | (uint)!bVar14 * auVar195._20_4_);
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar197._24_4_ =
               (float)((uint)bVar14 * auVar193._24_4_ | (uint)!bVar14 * auVar195._24_4_);
          bVar14 = SUB81(uVar16 >> 7,0);
          auVar197._28_4_ =
               (float)((uint)bVar14 * auVar193._28_4_ | (uint)!bVar14 * auVar195._28_4_);
          auVar177 = vfmsub231ps_fma(auVar196,auVar197,auVar296);
          auVar159 = vfnmsub231ps_fma(ZEXT1632(auVar177),auVar197,auVar329);
          auVar195 = ZEXT1632(auVar159);
          auVar177 = vfmadd213ps_fma(auVar305,auVar195,auVar309);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar313);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar317);
          auVar195 = ZEXT1632(auVar159);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar321);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),auVar195,auVar277);
          auVar177 = vfmadd213ps_fma(ZEXT1632(auVar177),
                                     ZEXT1632(CONCAT412(auVar159._12_4_ * auVar159._12_4_,
                                                        CONCAT48(auVar159._8_4_ * auVar159._8_4_,
                                                                 CONCAT44(auVar159._4_4_ *
                                                                          auVar159._4_4_,
                                                                          auVar159._0_4_ *
                                                                          auVar159._0_4_)))),
                                     auVar195);
          auVar246._0_4_ = auVar177._0_4_ + 1.0;
          auVar246._4_4_ = auVar177._4_4_ + 1.0;
          auVar246._8_4_ = auVar177._8_4_ + 1.0;
          auVar246._12_4_ = auVar177._12_4_ + 1.0;
          auVar246._16_4_ = 0x3f800000;
          auVar246._20_4_ = 0x3f800000;
          auVar246._24_4_ = 0x3f800000;
          auVar246._28_4_ = 0x3f800000;
          auVar265._0_4_ = (int)auVar197._0_4_;
          auVar265._4_4_ = (int)auVar197._4_4_;
          auVar265._8_4_ = (int)auVar197._8_4_;
          auVar265._12_4_ = (int)auVar197._12_4_;
          auVar265._16_4_ = (int)auVar197._16_4_;
          auVar265._20_4_ = (int)auVar197._20_4_;
          auVar265._24_4_ = (int)auVar197._24_4_;
          auVar265._28_4_ = (int)auVar197._28_4_;
          auVar195 = vpslld_avx2(auVar265,0x17);
          auVar195 = vpaddd_avx2(auVar325,auVar195);
          auVar177 = vfmadd213ps_fma(auVar195,auVar246,auVar291);
          auVar195 = vdivps_avx(auVar291,ZEXT1632(auVar177));
          auVar195 = vfnmadd213ps_avx512vl(auVar195,auVar192,auVar187);
          auVar184 = auVar195._0_28_;
          goto LAB_0029cbc5;
        case 6:
          puVar11 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar2 = *puVar11;
          auVar249._4_4_ = uVar2;
          auVar249._0_4_ = uVar2;
          auVar249._8_4_ = uVar2;
          auVar249._12_4_ = uVar2;
          auVar249._16_4_ = uVar2;
          auVar249._20_4_ = uVar2;
          auVar249._24_4_ = uVar2;
          auVar249._28_4_ = uVar2;
          uVar2 = puVar11[1];
          auVar75._4_4_ = uVar2;
          auVar75._0_4_ = uVar2;
          auVar75._8_4_ = uVar2;
          auVar75._12_4_ = uVar2;
          auVar75._16_4_ = uVar2;
          auVar75._20_4_ = uVar2;
          auVar75._24_4_ = uVar2;
          auVar75._28_4_ = uVar2;
          auVar195 = vfmadd213ps_avx512vl(auVar249,auVar229,auVar75);
          auVar195 = vmaxps_avx512vl(auVar195,ZEXT1632(auVar158));
          auVar195 = vminps_avx(auVar195,auVar291);
          auVar184 = auVar195._0_28_;
LAB_0029cbc5:
          auVar124._4_4_ = auVar184._4_4_ * auVar229._4_4_;
          auVar124._0_4_ = auVar184._0_4_ * auVar229._0_4_;
          auVar124._8_4_ = auVar184._8_4_ * auVar229._8_4_;
          auVar124._12_4_ = auVar184._12_4_ * auVar229._12_4_;
          auVar124._16_4_ = auVar184._16_4_ * auVar229._16_4_;
          auVar124._20_4_ = auVar184._20_4_ * auVar229._20_4_;
          auVar124._24_4_ = auVar184._24_4_ * auVar229._24_4_;
          auVar124._28_4_ = auVar197._28_4_;
          auVar197 = auVar124;
        }
switchD_0029c934_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + uVar138 * 0x20) = auVar197;
      }
    }
    else if (iVar152 == 0x10) {
      auVar208 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar209 = vxorps_avx512dq(auVar208,(undefined1  [64])_ps512_cephes_log_q2);
      auVar210 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar208);
      auVar211 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      uVar140 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar140 = 0;
      }
      auVar212 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar208);
      auVar213 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar158 = vxorps_avx512vl(auVar158,auVar158);
      auVar336 = ZEXT1664(auVar158);
      auVar214 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      for (uVar138 = 0; uVar138 != uVar140; uVar138 = uVar138 + 1) {
        auVar158 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        auVar335 = ZEXT1664(auVar158);
        auVar158 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar334 = ZEXT1664(auVar158);
        if (pvVar8 != (void *)0x0) {
          auVar334 = *(undefined1 (*) [64])((long)pvVar8 + uVar138 * 0x40);
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar141 = (long)(this->weight_data_tm).w;
        pauVar139 = (undefined1 (*) [32])(uVar138 * lVar141 * sVar10 + (long)pvVar9);
        lVar145 = 0;
        lVar148 = 0;
        iVar152 = 0;
        auVar158 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar158);
        auVar158 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar158);
        auVar158 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        in_ZMM21 = ZEXT1664(auVar158);
        auVar158 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        in_ZMM20 = ZEXT1664(auVar158);
        auVar158 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar158);
        auVar158 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
        in_ZMM23 = ZEXT1664(auVar158);
        pauVar149 = local_368;
        for (; iVar152 + 7 < iVar144; iVar152 = iVar152 + 8) {
          auVar215 = vcvtph2ps_avx512f(*pauVar139);
          auVar216 = vcvtph2ps_avx512f(pauVar139[1]);
          auVar217 = vcvtph2ps_avx512f(pauVar139[2]);
          auVar218 = vcvtph2ps_avx512f(pauVar139[3]);
          uVar2 = *(undefined4 *)*pauVar149;
          auVar219._4_4_ = uVar2;
          auVar219._0_4_ = uVar2;
          auVar219._8_4_ = uVar2;
          auVar219._12_4_ = uVar2;
          auVar219._16_4_ = uVar2;
          auVar219._20_4_ = uVar2;
          auVar219._24_4_ = uVar2;
          auVar219._28_4_ = uVar2;
          auVar219._32_4_ = uVar2;
          auVar219._36_4_ = uVar2;
          auVar219._40_4_ = uVar2;
          auVar219._44_4_ = uVar2;
          auVar219._48_4_ = uVar2;
          auVar219._52_4_ = uVar2;
          auVar219._56_4_ = uVar2;
          auVar219._60_4_ = uVar2;
          auVar334 = vfmadd231ps_avx512f(auVar334,auVar215,auVar219);
          uVar2 = *(undefined4 *)(*pauVar149 + 4);
          auVar215._4_4_ = uVar2;
          auVar215._0_4_ = uVar2;
          auVar215._8_4_ = uVar2;
          auVar215._12_4_ = uVar2;
          auVar215._16_4_ = uVar2;
          auVar215._20_4_ = uVar2;
          auVar215._24_4_ = uVar2;
          auVar215._28_4_ = uVar2;
          auVar215._32_4_ = uVar2;
          auVar215._36_4_ = uVar2;
          auVar215._40_4_ = uVar2;
          auVar215._44_4_ = uVar2;
          auVar215._48_4_ = uVar2;
          auVar215._52_4_ = uVar2;
          auVar215._56_4_ = uVar2;
          auVar215._60_4_ = uVar2;
          in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar216,auVar215);
          uVar2 = *(undefined4 *)(*pauVar149 + 8);
          auVar216._4_4_ = uVar2;
          auVar216._0_4_ = uVar2;
          auVar216._8_4_ = uVar2;
          auVar216._12_4_ = uVar2;
          auVar216._16_4_ = uVar2;
          auVar216._20_4_ = uVar2;
          auVar216._24_4_ = uVar2;
          auVar216._28_4_ = uVar2;
          auVar216._32_4_ = uVar2;
          auVar216._36_4_ = uVar2;
          auVar216._40_4_ = uVar2;
          auVar216._44_4_ = uVar2;
          auVar216._48_4_ = uVar2;
          auVar216._52_4_ = uVar2;
          auVar216._56_4_ = uVar2;
          auVar216._60_4_ = uVar2;
          in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar217,auVar216);
          uVar2 = *(undefined4 *)(*pauVar149 + 0xc);
          auVar217._4_4_ = uVar2;
          auVar217._0_4_ = uVar2;
          auVar217._8_4_ = uVar2;
          auVar217._12_4_ = uVar2;
          auVar217._16_4_ = uVar2;
          auVar217._20_4_ = uVar2;
          auVar217._24_4_ = uVar2;
          auVar217._28_4_ = uVar2;
          auVar217._32_4_ = uVar2;
          auVar217._36_4_ = uVar2;
          auVar217._40_4_ = uVar2;
          auVar217._44_4_ = uVar2;
          auVar217._48_4_ = uVar2;
          auVar217._52_4_ = uVar2;
          auVar217._56_4_ = uVar2;
          auVar217._60_4_ = uVar2;
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar218,auVar217);
          auVar219 = vcvtph2ps_avx512f(pauVar139[4]);
          auVar215 = vcvtph2ps_avx512f(pauVar139[5]);
          auVar216 = vcvtph2ps_avx512f(pauVar139[6]);
          auVar217 = vcvtph2ps_avx512f(pauVar139[7]);
          uVar2 = *(undefined4 *)(*pauVar149 + 0x10);
          auVar218._4_4_ = uVar2;
          auVar218._0_4_ = uVar2;
          auVar218._8_4_ = uVar2;
          auVar218._12_4_ = uVar2;
          auVar218._16_4_ = uVar2;
          auVar218._20_4_ = uVar2;
          auVar218._24_4_ = uVar2;
          auVar218._28_4_ = uVar2;
          auVar218._32_4_ = uVar2;
          auVar218._36_4_ = uVar2;
          auVar218._40_4_ = uVar2;
          auVar218._44_4_ = uVar2;
          auVar218._48_4_ = uVar2;
          auVar218._52_4_ = uVar2;
          auVar218._56_4_ = uVar2;
          auVar218._60_4_ = uVar2;
          in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar219,auVar218);
          uVar2 = *(undefined4 *)(*pauVar149 + 0x14);
          auVar110._4_4_ = uVar2;
          auVar110._0_4_ = uVar2;
          auVar110._8_4_ = uVar2;
          auVar110._12_4_ = uVar2;
          auVar110._16_4_ = uVar2;
          auVar110._20_4_ = uVar2;
          auVar110._24_4_ = uVar2;
          auVar110._28_4_ = uVar2;
          auVar110._32_4_ = uVar2;
          auVar110._36_4_ = uVar2;
          auVar110._40_4_ = uVar2;
          auVar110._44_4_ = uVar2;
          auVar110._48_4_ = uVar2;
          auVar110._52_4_ = uVar2;
          auVar110._56_4_ = uVar2;
          auVar110._60_4_ = uVar2;
          in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar215,auVar110);
          uVar2 = *(undefined4 *)(*pauVar149 + 0x18);
          auVar111._4_4_ = uVar2;
          auVar111._0_4_ = uVar2;
          auVar111._8_4_ = uVar2;
          auVar111._12_4_ = uVar2;
          auVar111._16_4_ = uVar2;
          auVar111._20_4_ = uVar2;
          auVar111._24_4_ = uVar2;
          auVar111._28_4_ = uVar2;
          auVar111._32_4_ = uVar2;
          auVar111._36_4_ = uVar2;
          auVar111._40_4_ = uVar2;
          auVar111._44_4_ = uVar2;
          auVar111._48_4_ = uVar2;
          auVar111._52_4_ = uVar2;
          auVar111._56_4_ = uVar2;
          auVar111._60_4_ = uVar2;
          in_ZMM18 = vfmadd231ps_avx512f(in_ZMM18,auVar216,auVar111);
          uVar2 = *(undefined4 *)(*pauVar149 + 0x1c);
          auVar112._4_4_ = uVar2;
          auVar112._0_4_ = uVar2;
          auVar112._8_4_ = uVar2;
          auVar112._12_4_ = uVar2;
          auVar112._16_4_ = uVar2;
          auVar112._20_4_ = uVar2;
          auVar112._24_4_ = uVar2;
          auVar112._28_4_ = uVar2;
          auVar112._32_4_ = uVar2;
          auVar112._36_4_ = uVar2;
          auVar112._40_4_ = uVar2;
          auVar112._44_4_ = uVar2;
          auVar112._48_4_ = uVar2;
          auVar112._52_4_ = uVar2;
          auVar112._56_4_ = uVar2;
          auVar112._60_4_ = uVar2;
          auVar335 = vfmadd231ps_avx512f(auVar335,auVar217,auVar112);
          pauVar149 = pauVar149 + 1;
          pauVar139 = pauVar139 + 8;
          lVar148 = lVar148 + 0x20;
          lVar145 = lVar145 + 8;
        }
        lVar141 = sVar10 * uVar138 * lVar141;
        for (; iVar152 + 3 < iVar144; iVar152 = iVar152 + 4) {
          auVar219 = vcvtph2ps_avx512f(*(undefined1 (*) [32])((long)pvVar9 + lVar148 * 8 + lVar141))
          ;
          auVar215 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar148 * 8 + lVar141 + 0x20));
          auVar216 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar148 * 8 + lVar141 + 0x40));
          auVar217 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar148 * 8 + lVar141 + 0x60));
          uVar2 = *(undefined4 *)(*local_368 + lVar148);
          auVar113._4_4_ = uVar2;
          auVar113._0_4_ = uVar2;
          auVar113._8_4_ = uVar2;
          auVar113._12_4_ = uVar2;
          auVar113._16_4_ = uVar2;
          auVar113._20_4_ = uVar2;
          auVar113._24_4_ = uVar2;
          auVar113._28_4_ = uVar2;
          auVar113._32_4_ = uVar2;
          auVar113._36_4_ = uVar2;
          auVar113._40_4_ = uVar2;
          auVar113._44_4_ = uVar2;
          auVar113._48_4_ = uVar2;
          auVar113._52_4_ = uVar2;
          auVar113._56_4_ = uVar2;
          auVar113._60_4_ = uVar2;
          auVar334 = vfmadd231ps_avx512f(auVar334,auVar219,auVar113);
          uVar2 = *(undefined4 *)(*local_368 + lVar148 + 4);
          auVar114._4_4_ = uVar2;
          auVar114._0_4_ = uVar2;
          auVar114._8_4_ = uVar2;
          auVar114._12_4_ = uVar2;
          auVar114._16_4_ = uVar2;
          auVar114._20_4_ = uVar2;
          auVar114._24_4_ = uVar2;
          auVar114._28_4_ = uVar2;
          auVar114._32_4_ = uVar2;
          auVar114._36_4_ = uVar2;
          auVar114._40_4_ = uVar2;
          auVar114._44_4_ = uVar2;
          auVar114._48_4_ = uVar2;
          auVar114._52_4_ = uVar2;
          auVar114._56_4_ = uVar2;
          auVar114._60_4_ = uVar2;
          in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar215,auVar114);
          uVar2 = *(undefined4 *)(*local_368 + lVar148 + 8);
          auVar115._4_4_ = uVar2;
          auVar115._0_4_ = uVar2;
          auVar115._8_4_ = uVar2;
          auVar115._12_4_ = uVar2;
          auVar115._16_4_ = uVar2;
          auVar115._20_4_ = uVar2;
          auVar115._24_4_ = uVar2;
          auVar115._28_4_ = uVar2;
          auVar115._32_4_ = uVar2;
          auVar115._36_4_ = uVar2;
          auVar115._40_4_ = uVar2;
          auVar115._44_4_ = uVar2;
          auVar115._48_4_ = uVar2;
          auVar115._52_4_ = uVar2;
          auVar115._56_4_ = uVar2;
          auVar115._60_4_ = uVar2;
          in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar216,auVar115);
          uVar2 = *(undefined4 *)(*local_368 + lVar148 + 0xc);
          auVar116._4_4_ = uVar2;
          auVar116._0_4_ = uVar2;
          auVar116._8_4_ = uVar2;
          auVar116._12_4_ = uVar2;
          auVar116._16_4_ = uVar2;
          auVar116._20_4_ = uVar2;
          auVar116._24_4_ = uVar2;
          auVar116._28_4_ = uVar2;
          auVar116._32_4_ = uVar2;
          auVar116._36_4_ = uVar2;
          auVar116._40_4_ = uVar2;
          auVar116._44_4_ = uVar2;
          auVar116._48_4_ = uVar2;
          auVar116._52_4_ = uVar2;
          auVar116._56_4_ = uVar2;
          auVar116._60_4_ = uVar2;
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar217,auVar116);
          pauVar139 = pauVar139 + 4;
          lVar148 = lVar148 + 0x10;
          lVar145 = lVar145 + 4;
        }
        for (; (int)lVar145 < iVar144; lVar145 = lVar145 + 1) {
          auVar185 = vlddqu_avx(*pauVar139);
          auVar219 = vcvtph2ps_avx512f(auVar185);
          uVar2 = *(undefined4 *)(*local_368 + lVar145 * 4);
          auVar117._4_4_ = uVar2;
          auVar117._0_4_ = uVar2;
          auVar117._8_4_ = uVar2;
          auVar117._12_4_ = uVar2;
          auVar117._16_4_ = uVar2;
          auVar117._20_4_ = uVar2;
          auVar117._24_4_ = uVar2;
          auVar117._28_4_ = uVar2;
          auVar117._32_4_ = uVar2;
          auVar117._36_4_ = uVar2;
          auVar117._40_4_ = uVar2;
          auVar117._44_4_ = uVar2;
          auVar117._48_4_ = uVar2;
          auVar117._52_4_ = uVar2;
          auVar117._56_4_ = uVar2;
          auVar117._60_4_ = uVar2;
          auVar334 = vfmadd231ps_avx512f(auVar334,auVar219,auVar117);
          pauVar139 = pauVar139 + 1;
        }
        auVar335 = vaddps_avx512f(in_ZMM18,auVar335);
        auVar219 = vaddps_avx512f(in_ZMM19,in_ZMM21);
        auVar335 = vaddps_avx512f(auVar335,auVar219);
        auVar219 = vaddps_avx512f(in_ZMM20,in_ZMM22);
        in_ZMM17 = vaddps_avx512f(auVar219,in_ZMM23);
        auVar335 = vaddps_avx512f(auVar335,in_ZMM17);
        auVar334 = vaddps_avx512f(auVar335,auVar334);
        in_ZMM16 = auVar334;
        switch(iVar136) {
        case 1:
          in_ZMM16 = vmaxps_avx512f(auVar334,auVar336);
          break;
        case 2:
          uVar16 = vcmpps_avx512f(auVar334,auVar336,1);
          uVar2 = *(this->super_InnerProduct).activation_params.data;
          auVar119._4_4_ = uVar2;
          auVar119._0_4_ = uVar2;
          auVar119._8_4_ = uVar2;
          auVar119._12_4_ = uVar2;
          auVar119._16_4_ = uVar2;
          auVar119._20_4_ = uVar2;
          auVar119._24_4_ = uVar2;
          auVar119._28_4_ = uVar2;
          auVar119._32_4_ = uVar2;
          auVar119._36_4_ = uVar2;
          auVar119._40_4_ = uVar2;
          auVar119._44_4_ = uVar2;
          auVar119._48_4_ = uVar2;
          auVar119._52_4_ = uVar2;
          auVar119._56_4_ = uVar2;
          auVar119._60_4_ = uVar2;
          auVar335 = vmulps_avx512f(auVar334,auVar119);
          bVar14 = (bool)((byte)uVar16 & 1);
          in_ZMM16._0_4_ = (uint)bVar14 * auVar335._0_4_ | (uint)!bVar14 * auVar334._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          in_ZMM16._4_4_ = (uint)bVar14 * auVar335._4_4_ | (uint)!bVar14 * auVar334._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          in_ZMM16._8_4_ = (uint)bVar14 * auVar335._8_4_ | (uint)!bVar14 * auVar334._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          in_ZMM16._12_4_ = (uint)bVar14 * auVar335._12_4_ | (uint)!bVar14 * auVar334._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          in_ZMM16._16_4_ = (uint)bVar14 * auVar335._16_4_ | (uint)!bVar14 * auVar334._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          in_ZMM16._20_4_ = (uint)bVar14 * auVar335._20_4_ | (uint)!bVar14 * auVar334._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          in_ZMM16._24_4_ = (uint)bVar14 * auVar335._24_4_ | (uint)!bVar14 * auVar334._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          in_ZMM16._28_4_ = (uint)bVar14 * auVar335._28_4_ | (uint)!bVar14 * auVar334._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          in_ZMM16._32_4_ = (uint)bVar14 * auVar335._32_4_ | (uint)!bVar14 * auVar334._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          in_ZMM16._36_4_ = (uint)bVar14 * auVar335._36_4_ | (uint)!bVar14 * auVar334._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          in_ZMM16._40_4_ = (uint)bVar14 * auVar335._40_4_ | (uint)!bVar14 * auVar334._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          in_ZMM16._44_4_ = (uint)bVar14 * auVar335._44_4_ | (uint)!bVar14 * auVar334._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          in_ZMM16._48_4_ = (uint)bVar14 * auVar335._48_4_ | (uint)!bVar14 * auVar334._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          in_ZMM16._52_4_ = (uint)bVar14 * auVar335._52_4_ | (uint)!bVar14 * auVar334._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          in_ZMM16._56_4_ = (uint)bVar14 * auVar335._56_4_ | (uint)!bVar14 * auVar334._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          in_ZMM16._60_4_ = (uint)bVar14 * auVar335._60_4_ | (uint)!bVar14 * auVar334._60_4_;
          break;
        case 3:
          puVar11 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar2 = *puVar11;
          auVar118._4_4_ = uVar2;
          auVar118._0_4_ = uVar2;
          auVar118._8_4_ = uVar2;
          auVar118._12_4_ = uVar2;
          auVar118._16_4_ = uVar2;
          auVar118._20_4_ = uVar2;
          auVar118._24_4_ = uVar2;
          auVar118._28_4_ = uVar2;
          auVar118._32_4_ = uVar2;
          auVar118._36_4_ = uVar2;
          auVar118._40_4_ = uVar2;
          auVar118._44_4_ = uVar2;
          auVar118._48_4_ = uVar2;
          auVar118._52_4_ = uVar2;
          auVar118._56_4_ = uVar2;
          auVar118._60_4_ = uVar2;
          auVar335 = vmaxps_avx512f(auVar334,auVar118);
          uVar2 = puVar11[1];
          auVar334._4_4_ = uVar2;
          auVar334._0_4_ = uVar2;
          auVar334._8_4_ = uVar2;
          auVar334._12_4_ = uVar2;
          auVar334._16_4_ = uVar2;
          auVar334._20_4_ = uVar2;
          auVar334._24_4_ = uVar2;
          auVar334._28_4_ = uVar2;
          auVar334._32_4_ = uVar2;
          auVar334._36_4_ = uVar2;
          auVar334._40_4_ = uVar2;
          auVar334._44_4_ = uVar2;
          auVar334._48_4_ = uVar2;
          auVar334._52_4_ = uVar2;
          auVar334._56_4_ = uVar2;
          auVar334._60_4_ = uVar2;
          in_ZMM16 = vminps_avx512f(auVar335,auVar334);
          break;
        case 4:
          auVar334 = vxorps_avx512dq(auVar334,auVar208);
          auVar334 = vminps_avx512f(auVar334,(undefined1  [64])afVar126);
          auVar334 = vmaxps_avx512f(auVar334,(undefined1  [64])afVar127);
          auVar335 = vfmadd213ps_avx512f((undefined1  [64])afVar128,auVar334,
                                         (undefined1  [64])afVar134);
          auVar219 = vrndscaleps_avx512f(auVar335,1);
          uVar16 = vcmpps_avx512f(auVar335,auVar219,1);
          auVar335 = vsubps_avx512f(auVar219,(undefined1  [64])afVar125);
          bVar14 = (bool)((byte)uVar16 & 1);
          in_ZMM17._0_4_ = (uint)bVar14 * auVar335._0_4_ | (uint)!bVar14 * auVar219._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          in_ZMM17._4_4_ = (uint)bVar14 * auVar335._4_4_ | (uint)!bVar14 * auVar219._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          in_ZMM17._8_4_ = (uint)bVar14 * auVar335._8_4_ | (uint)!bVar14 * auVar219._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          in_ZMM17._12_4_ = (uint)bVar14 * auVar335._12_4_ | (uint)!bVar14 * auVar219._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          in_ZMM17._16_4_ = (uint)bVar14 * auVar335._16_4_ | (uint)!bVar14 * auVar219._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          in_ZMM17._20_4_ = (uint)bVar14 * auVar335._20_4_ | (uint)!bVar14 * auVar219._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          in_ZMM17._24_4_ = (uint)bVar14 * auVar335._24_4_ | (uint)!bVar14 * auVar219._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          in_ZMM17._28_4_ = (uint)bVar14 * auVar335._28_4_ | (uint)!bVar14 * auVar219._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          in_ZMM17._32_4_ = (uint)bVar14 * auVar335._32_4_ | (uint)!bVar14 * auVar219._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          in_ZMM17._36_4_ = (uint)bVar14 * auVar335._36_4_ | (uint)!bVar14 * auVar219._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          in_ZMM17._40_4_ = (uint)bVar14 * auVar335._40_4_ | (uint)!bVar14 * auVar219._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          in_ZMM17._44_4_ = (uint)bVar14 * auVar335._44_4_ | (uint)!bVar14 * auVar219._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          in_ZMM17._48_4_ = (uint)bVar14 * auVar335._48_4_ | (uint)!bVar14 * auVar219._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          in_ZMM17._52_4_ = (uint)bVar14 * auVar335._52_4_ | (uint)!bVar14 * auVar219._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          in_ZMM17._56_4_ = (uint)bVar14 * auVar335._56_4_ | (uint)!bVar14 * auVar219._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          in_ZMM17._60_4_ = (uint)bVar14 * auVar335._60_4_ | (uint)!bVar14 * auVar219._60_4_;
          auVar334 = vfmadd231ps_avx512f(auVar334,in_ZMM17,auVar209);
          auVar334 = vfmadd231ps_avx512f(auVar334,in_ZMM17,auVar210);
          auVar335 = vmulps_avx512f(auVar334,auVar334);
          auVar219 = vfmadd213ps_avx512f(auVar334,(undefined1  [64])afVar129,
                                         (undefined1  [64])afVar130);
          auVar219 = vfmadd213ps_avx512f(auVar219,auVar334,(undefined1  [64])afVar131);
          auVar219 = vfmadd213ps_avx512f(auVar219,auVar334,(undefined1  [64])afVar132);
          auVar219 = vfmadd213ps_avx512f(auVar219,auVar334,(undefined1  [64])afVar133);
          auVar219 = vfmadd213ps_avx512f(auVar219,auVar334,(undefined1  [64])afVar134);
          in_ZMM18 = vfmadd213ps_avx512f(auVar219,auVar335,auVar334);
          auVar334 = vaddps_avx512f(in_ZMM18,(undefined1  [64])afVar125);
          auVar335 = vcvttps2dq_avx512f(in_ZMM17);
          auVar335 = vpaddd_avx512f(auVar335,auVar211);
          auVar335 = vpslld_avx512f(auVar335,0x17);
          auVar334 = vfmadd213ps_avx512f(auVar335,auVar334,auVar213);
          in_ZMM16 = vdivps_avx512f(auVar213,auVar334);
          break;
        case 5:
          auVar335 = vminps_avx512f(auVar334,(undefined1  [64])afVar126);
          auVar335 = vmaxps_avx512f(auVar335,(undefined1  [64])afVar127);
          auVar219 = vfmadd213ps_avx512f((undefined1  [64])afVar128,auVar335,
                                         (undefined1  [64])afVar134);
          auVar215 = vrndscaleps_avx512f(auVar219,1);
          uVar16 = vcmpps_avx512f(auVar219,auVar215,1);
          auVar219 = vsubps_avx512f(auVar215,(undefined1  [64])afVar125);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar220._0_4_ = (uint)bVar14 * auVar219._0_4_ | (uint)!bVar14 * auVar215._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar220._4_4_ = (uint)bVar14 * auVar219._4_4_ | (uint)!bVar14 * auVar215._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar220._8_4_ = (uint)bVar14 * auVar219._8_4_ | (uint)!bVar14 * auVar215._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar220._12_4_ = (uint)bVar14 * auVar219._12_4_ | (uint)!bVar14 * auVar215._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar220._16_4_ = (uint)bVar14 * auVar219._16_4_ | (uint)!bVar14 * auVar215._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar220._20_4_ = (uint)bVar14 * auVar219._20_4_ | (uint)!bVar14 * auVar215._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar220._24_4_ = (uint)bVar14 * auVar219._24_4_ | (uint)!bVar14 * auVar215._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          auVar220._28_4_ = (uint)bVar14 * auVar219._28_4_ | (uint)!bVar14 * auVar215._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          auVar220._32_4_ = (uint)bVar14 * auVar219._32_4_ | (uint)!bVar14 * auVar215._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          auVar220._36_4_ = (uint)bVar14 * auVar219._36_4_ | (uint)!bVar14 * auVar215._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          auVar220._40_4_ = (uint)bVar14 * auVar219._40_4_ | (uint)!bVar14 * auVar215._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          auVar220._44_4_ = (uint)bVar14 * auVar219._44_4_ | (uint)!bVar14 * auVar215._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          auVar220._48_4_ = (uint)bVar14 * auVar219._48_4_ | (uint)!bVar14 * auVar215._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          auVar220._52_4_ = (uint)bVar14 * auVar219._52_4_ | (uint)!bVar14 * auVar215._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          auVar220._56_4_ = (uint)bVar14 * auVar219._56_4_ | (uint)!bVar14 * auVar215._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          auVar220._60_4_ = (uint)bVar14 * auVar219._60_4_ | (uint)!bVar14 * auVar215._60_4_;
          auVar335 = vfmadd231ps_avx512f(auVar335,auVar220,auVar209);
          auVar335 = vfmadd231ps_avx512f(auVar335,auVar220,auVar210);
          auVar219 = vmulps_avx512f(auVar335,auVar335);
          auVar215 = vfmadd213ps_avx512f(auVar335,(undefined1  [64])afVar129,
                                         (undefined1  [64])afVar130);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar335,(undefined1  [64])afVar131);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar335,(undefined1  [64])afVar132);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar335,(undefined1  [64])afVar133);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar335,(undefined1  [64])afVar134);
          auVar335 = vfmadd213ps_avx512f(auVar215,auVar219,auVar335);
          auVar335 = vaddps_avx512f(auVar335,(undefined1  [64])afVar125);
          auVar219 = vcvttps2dq_avx512f(auVar220);
          auVar219 = vpaddd_avx512f(auVar219,auVar211);
          auVar219 = vpslld_avx512f(auVar219,0x17);
          auVar335 = vfmadd213ps_avx512f(auVar219,auVar335,auVar213);
          auVar219 = vmaxps_avx512f(auVar335,(undefined1  [64])_ps512_min_norm_pos);
          auVar215 = vpsrld_avx512f(auVar219,0x17);
          auVar219 = vpternlogd_avx512f(auVar219,(undefined1  [64])afVar134,
                                        (undefined1  [64])_ps512_inv_mant_mask,0xec);
          uVar16 = vcmpps_avx512f(auVar219,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar216 = vsubps_avx512f(auVar219,(undefined1  [64])afVar125);
          auVar219 = vaddps_avx512f(auVar216,auVar219);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar221._0_4_ = (uint)bVar14 * auVar219._0_4_ | (uint)!bVar14 * auVar216._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar221._4_4_ = (uint)bVar14 * auVar219._4_4_ | (uint)!bVar14 * auVar216._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar221._8_4_ = (uint)bVar14 * auVar219._8_4_ | (uint)!bVar14 * auVar216._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar221._12_4_ = (uint)bVar14 * auVar219._12_4_ | (uint)!bVar14 * auVar216._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar221._16_4_ = (uint)bVar14 * auVar219._16_4_ | (uint)!bVar14 * auVar216._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar221._20_4_ = (uint)bVar14 * auVar219._20_4_ | (uint)!bVar14 * auVar216._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar221._24_4_ = (uint)bVar14 * auVar219._24_4_ | (uint)!bVar14 * auVar216._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          auVar221._28_4_ = (uint)bVar14 * auVar219._28_4_ | (uint)!bVar14 * auVar216._28_4_;
          bVar15 = (byte)(uVar16 >> 8);
          bVar14 = (bool)(bVar15 & 1);
          auVar221._32_4_ = (uint)bVar14 * auVar219._32_4_ | (uint)!bVar14 * auVar216._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          auVar221._36_4_ = (uint)bVar14 * auVar219._36_4_ | (uint)!bVar14 * auVar216._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          auVar221._40_4_ = (uint)bVar14 * auVar219._40_4_ | (uint)!bVar14 * auVar216._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          auVar221._44_4_ = (uint)bVar14 * auVar219._44_4_ | (uint)!bVar14 * auVar216._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          auVar221._48_4_ = (uint)bVar14 * auVar219._48_4_ | (uint)!bVar14 * auVar216._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          auVar221._52_4_ = (uint)bVar14 * auVar219._52_4_ | (uint)!bVar14 * auVar216._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          auVar221._56_4_ = (uint)bVar14 * auVar219._56_4_ | (uint)!bVar14 * auVar216._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          auVar221._60_4_ = (uint)bVar14 * auVar219._60_4_ | (uint)!bVar14 * auVar216._60_4_;
          auVar219 = vmulps_avx512f(auVar221,auVar221);
          auVar216 = vfmadd132ps_avx512f(auVar221,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar216 = vfmadd213ps_avx512f(auVar216,auVar221,(undefined1  [64])_ps512_cephes_log_p2);
          auVar216 = vfmadd213ps_avx512f(auVar216,auVar221,(undefined1  [64])_ps512_cephes_log_p3);
          auVar216 = vfmadd213ps_avx512f(auVar216,auVar221,(undefined1  [64])_ps512_cephes_log_p4);
          auVar216 = vfmadd213ps_avx512f(auVar216,auVar221,(undefined1  [64])_ps512_cephes_log_p5);
          auVar216 = vfmadd213ps_avx512f(auVar216,auVar221,(undefined1  [64])_ps512_cephes_log_p6);
          auVar216 = vfmadd213ps_avx512f(auVar216,auVar221,(undefined1  [64])_ps512_cephes_log_p7);
          in_ZMM20 = vfmadd213ps_avx512f(auVar216,auVar221,(undefined1  [64])_ps512_cephes_log_p8);
          auVar216 = vmulps_avx512f(auVar219,auVar221);
          auVar216 = vfmadd213ps_avx512f(auVar216,in_ZMM20,auVar221);
          uVar17 = vcmpps_avx512f(auVar335,auVar336,2);
          auVar335 = vpsubd_avx512f(auVar215,auVar211);
          auVar335 = vcvtdq2ps_avx512f(auVar335);
          auVar215 = vaddps_avx512f(auVar335,(undefined1  [64])afVar125);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar222._0_4_ = (uint)bVar14 * auVar335._0_4_ | (uint)!bVar14 * auVar215._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar222._4_4_ = (uint)bVar14 * auVar335._4_4_ | (uint)!bVar14 * auVar215._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar222._8_4_ = (uint)bVar14 * auVar335._8_4_ | (uint)!bVar14 * auVar215._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar222._12_4_ = (uint)bVar14 * auVar335._12_4_ | (uint)!bVar14 * auVar215._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar222._16_4_ = (uint)bVar14 * auVar335._16_4_ | (uint)!bVar14 * auVar215._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar222._20_4_ = (uint)bVar14 * auVar335._20_4_ | (uint)!bVar14 * auVar215._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar222._24_4_ = (uint)bVar14 * auVar335._24_4_ | (uint)!bVar14 * auVar215._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          auVar222._28_4_ = (uint)bVar14 * auVar335._28_4_ | (uint)!bVar14 * auVar215._28_4_;
          bVar14 = (bool)(bVar15 & 1);
          auVar222._32_4_ = (uint)bVar14 * auVar335._32_4_ | (uint)!bVar14 * auVar215._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          auVar222._36_4_ = (uint)bVar14 * auVar335._36_4_ | (uint)!bVar14 * auVar215._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          auVar222._40_4_ = (uint)bVar14 * auVar335._40_4_ | (uint)!bVar14 * auVar215._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          auVar222._44_4_ = (uint)bVar14 * auVar335._44_4_ | (uint)!bVar14 * auVar215._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          auVar222._48_4_ = (uint)bVar14 * auVar335._48_4_ | (uint)!bVar14 * auVar215._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          auVar222._52_4_ = (uint)bVar14 * auVar335._52_4_ | (uint)!bVar14 * auVar215._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          auVar222._56_4_ = (uint)bVar14 * auVar335._56_4_ | (uint)!bVar14 * auVar215._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          auVar222._60_4_ = (uint)bVar14 * auVar335._60_4_ | (uint)!bVar14 * auVar215._60_4_;
          auVar335 = vfmadd231ps_avx512f(auVar216,auVar222,(undefined1  [64])afVar135);
          auVar335 = vfmadd231ps_avx512f(auVar335,auVar212,auVar219);
          in_ZMM21 = vfmadd231ps_avx512f(auVar335,auVar222,(undefined1  [64])_ps512_cephes_log_q2);
          auVar335 = vmulps_avx512f(in_ZMM21,auVar214);
          auVar219 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          bVar14 = (bool)((byte)uVar17 & 1);
          auVar223._0_4_ = (uint)bVar14 * auVar219._0_4_ | (uint)!bVar14 * auVar335._0_4_;
          bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar223._4_4_ = (uint)bVar14 * auVar219._4_4_ | (uint)!bVar14 * auVar335._4_4_;
          bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar223._8_4_ = (uint)bVar14 * auVar219._8_4_ | (uint)!bVar14 * auVar335._8_4_;
          bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar223._12_4_ = (uint)bVar14 * auVar219._12_4_ | (uint)!bVar14 * auVar335._12_4_;
          bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar223._16_4_ = (uint)bVar14 * auVar219._16_4_ | (uint)!bVar14 * auVar335._16_4_;
          bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar223._20_4_ = (uint)bVar14 * auVar219._20_4_ | (uint)!bVar14 * auVar335._20_4_;
          bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar223._24_4_ = (uint)bVar14 * auVar219._24_4_ | (uint)!bVar14 * auVar335._24_4_;
          bVar14 = (bool)((byte)(uVar17 >> 7) & 1);
          auVar223._28_4_ = (uint)bVar14 * auVar219._28_4_ | (uint)!bVar14 * auVar335._28_4_;
          bVar14 = (bool)((byte)(uVar17 >> 8) & 1);
          auVar223._32_4_ = (uint)bVar14 * auVar219._32_4_ | (uint)!bVar14 * auVar335._32_4_;
          bVar14 = (bool)((byte)(uVar17 >> 9) & 1);
          auVar223._36_4_ = (uint)bVar14 * auVar219._36_4_ | (uint)!bVar14 * auVar335._36_4_;
          bVar14 = (bool)((byte)(uVar17 >> 10) & 1);
          auVar223._40_4_ = (uint)bVar14 * auVar219._40_4_ | (uint)!bVar14 * auVar335._40_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xb) & 1);
          auVar223._44_4_ = (uint)bVar14 * auVar219._44_4_ | (uint)!bVar14 * auVar335._44_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xc) & 1);
          auVar223._48_4_ = (uint)bVar14 * auVar219._48_4_ | (uint)!bVar14 * auVar335._48_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xd) & 1);
          auVar223._52_4_ = (uint)bVar14 * auVar219._52_4_ | (uint)!bVar14 * auVar335._52_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xe) & 1);
          auVar223._56_4_ = (uint)bVar14 * auVar219._56_4_ | (uint)!bVar14 * auVar335._56_4_;
          bVar14 = SUB81(uVar17 >> 0xf,0);
          auVar223._60_4_ = (uint)bVar14 * auVar219._60_4_ | (uint)!bVar14 * auVar335._60_4_;
          auVar335 = vminps_avx512f(auVar223,(undefined1  [64])afVar126);
          auVar335 = vmaxps_avx512f(auVar335,(undefined1  [64])afVar127);
          auVar219 = vfmadd213ps_avx512f((undefined1  [64])afVar128,auVar335,
                                         (undefined1  [64])afVar134);
          auVar215 = vrndscaleps_avx512f(auVar219,1);
          uVar16 = vcmpps_avx512f(auVar219,auVar215,1);
          auVar219 = vsubps_avx512f(auVar215,(undefined1  [64])afVar125);
          bVar14 = (bool)((byte)uVar16 & 1);
          in_ZMM18._0_4_ = (uint)bVar14 * auVar219._0_4_ | (uint)!bVar14 * auVar215._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          in_ZMM18._4_4_ = (uint)bVar14 * auVar219._4_4_ | (uint)!bVar14 * auVar215._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          in_ZMM18._8_4_ = (uint)bVar14 * auVar219._8_4_ | (uint)!bVar14 * auVar215._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          in_ZMM18._12_4_ = (uint)bVar14 * auVar219._12_4_ | (uint)!bVar14 * auVar215._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          in_ZMM18._16_4_ = (uint)bVar14 * auVar219._16_4_ | (uint)!bVar14 * auVar215._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          in_ZMM18._20_4_ = (uint)bVar14 * auVar219._20_4_ | (uint)!bVar14 * auVar215._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          in_ZMM18._24_4_ = (uint)bVar14 * auVar219._24_4_ | (uint)!bVar14 * auVar215._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          in_ZMM18._28_4_ = (uint)bVar14 * auVar219._28_4_ | (uint)!bVar14 * auVar215._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          in_ZMM18._32_4_ = (uint)bVar14 * auVar219._32_4_ | (uint)!bVar14 * auVar215._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          in_ZMM18._36_4_ = (uint)bVar14 * auVar219._36_4_ | (uint)!bVar14 * auVar215._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          in_ZMM18._40_4_ = (uint)bVar14 * auVar219._40_4_ | (uint)!bVar14 * auVar215._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          in_ZMM18._44_4_ = (uint)bVar14 * auVar219._44_4_ | (uint)!bVar14 * auVar215._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          in_ZMM18._48_4_ = (uint)bVar14 * auVar219._48_4_ | (uint)!bVar14 * auVar215._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          in_ZMM18._52_4_ = (uint)bVar14 * auVar219._52_4_ | (uint)!bVar14 * auVar215._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          in_ZMM18._56_4_ = (uint)bVar14 * auVar219._56_4_ | (uint)!bVar14 * auVar215._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          in_ZMM18._60_4_ = (uint)bVar14 * auVar219._60_4_ | (uint)!bVar14 * auVar215._60_4_;
          auVar335 = vfmadd231ps_avx512f(auVar335,in_ZMM18,auVar209);
          auVar335 = vfmadd231ps_avx512f(auVar335,in_ZMM18,auVar210);
          auVar219 = vmulps_avx512f(auVar335,auVar335);
          auVar215 = vfmadd213ps_avx512f(auVar335,(undefined1  [64])afVar129,
                                         (undefined1  [64])afVar130);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar335,(undefined1  [64])afVar131);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar335,(undefined1  [64])afVar132);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar335,(undefined1  [64])afVar133);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar335,(undefined1  [64])afVar134);
          in_ZMM19 = vfmadd213ps_avx512f(auVar215,auVar219,auVar335);
          auVar335 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar125);
          auVar219 = vcvttps2dq_avx512f(in_ZMM18);
          auVar219 = vpaddd_avx512f(auVar219,auVar211);
          auVar219 = vpslld_avx512f(auVar219,0x17);
          in_ZMM17 = vfmadd213ps_avx512f(auVar219,auVar335,auVar213);
          auVar335 = vdivps_avx512f(auVar213,in_ZMM17);
          auVar335 = vfnmsub213ps_avx512f(auVar335,auVar214,auVar213);
          goto LAB_0029c116;
        case 6:
          puVar12 = (uint *)(this->super_InnerProduct).activation_params.data;
          auVar219 = vbroadcastss_avx512f(ZEXT416(*puVar12));
          uVar6 = puVar12[1];
          auVar335._4_4_ = uVar6;
          auVar335._0_4_ = uVar6;
          auVar335._8_4_ = uVar6;
          auVar335._12_4_ = uVar6;
          auVar335._16_4_ = uVar6;
          auVar335._20_4_ = uVar6;
          auVar335._24_4_ = uVar6;
          auVar335._28_4_ = uVar6;
          auVar335._32_4_ = uVar6;
          auVar335._36_4_ = uVar6;
          auVar335._40_4_ = uVar6;
          auVar335._44_4_ = uVar6;
          auVar335._48_4_ = uVar6;
          auVar335._52_4_ = uVar6;
          auVar335._56_4_ = uVar6;
          auVar335._60_4_ = uVar6;
          auVar335 = vfmadd213ps_avx512f(auVar219,auVar334,auVar335);
          auVar335 = vmaxps_avx512f(auVar335,auVar336);
          auVar335 = vminps_avx512f(auVar335,auVar213);
LAB_0029c116:
          in_ZMM16 = vmulps_avx512f(auVar335,auVar334);
        }
        *(undefined1 (*) [64])((long)top_blob->data + uVar138 * 0x40) = in_ZMM16;
      }
    }
    iVar152 = 0;
  }
LAB_0029dffb:
  if (piStack_360 != (int *)0x0) {
    LOCK();
    *piStack_360 = *piStack_360 + -1;
    UNLOCK();
    if (*piStack_360 == 0) {
      if (local_348 == (Allocator *)0x0) {
        free(local_368);
      }
      else {
        (*local_348->_vptr_Allocator[3])();
      }
    }
  }
  return iVar152;
}

Assistant:

int InnerProduct_x86_avx512::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}